

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx512::CurveNiIntersectorK<4,8>::
     intersect_hn<embree::avx512::OrientedCurve1IntersectorK<embree::HermiteCurveT,8>,embree::avx512::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  ulong uVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  Geometry *pGVar7;
  long lVar8;
  __int_type_conflict _Var9;
  RTCFilterFunctionN p_Var10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  byte bVar27;
  uint uVar28;
  ulong uVar29;
  long lVar31;
  uint uVar32;
  ulong uVar33;
  undefined8 in_R11;
  ulong uVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  bool bVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar95 [32];
  undefined1 auVar97 [32];
  undefined1 auVar99 [32];
  undefined1 auVar101 [32];
  float fVar103;
  vint4 bi_2;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  float fVar108;
  undefined4 uVar109;
  float fVar114;
  float fVar115;
  vint4 bi_1;
  float fVar116;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [32];
  vint4 ai_2;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  vint4 bi;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [32];
  vint4 ai;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [32];
  vint4 ai_1;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  vfloat4 a0_3;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  __m128 a_1;
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  __m128 a;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [32];
  float fVar195;
  float fVar204;
  float fVar205;
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  float fVar206;
  float fVar207;
  float fVar218;
  float fVar219;
  vfloat4 a0_1;
  undefined1 auVar208 [16];
  float fVar220;
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  float fVar221;
  float fVar226;
  float fVar227;
  vfloat4 a0;
  undefined1 auVar222 [16];
  float fVar228;
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [64];
  undefined1 auVar238 [64];
  undefined1 auVar239 [64];
  undefined1 auVar240 [64];
  undefined1 auVar241 [64];
  undefined1 auVar242 [64];
  undefined1 auVar243 [64];
  undefined1 in_ZMM29 [64];
  undefined1 auVar244 [64];
  undefined1 auVar245 [64];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  uint local_468;
  RTCFilterFunctionNArguments local_460;
  uint auStack_430 [4];
  undefined1 local_420 [32];
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  undefined1 local_390 [8];
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [16];
  undefined1 local_370 [16];
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  undefined1 local_350 [16];
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  undefined1 local_330 [16];
  undefined1 local_320 [16];
  undefined1 local_310 [16];
  undefined1 local_300 [16];
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [16];
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [16];
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [16];
  undefined1 local_290 [8];
  float fStack_288;
  float fStack_284;
  undefined1 local_280 [16];
  undefined1 local_270 [16];
  undefined1 local_260 [32];
  undefined8 uStack_240;
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined4 local_1c0;
  undefined4 uStack_1bc;
  undefined4 uStack_1b8;
  undefined4 uStack_1b4;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  undefined4 uStack_1a8;
  undefined4 uStack_1a4;
  ulong auStack_1a0 [4];
  RTCHitN local_180 [32];
  undefined1 local_160 [32];
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [32];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar30;
  undefined1 auVar94 [32];
  undefined1 auVar96 [32];
  undefined1 auVar98 [32];
  undefined1 auVar100 [32];
  undefined1 auVar102 [32];
  float fVar133;
  float fVar138;
  float fVar139;
  float fVar148;
  
  uVar29 = (ulong)(byte)prim[1];
  fVar103 = *(float *)(prim + uVar29 * 0x19 + 0x12);
  auVar42 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar42 = vinsertps_avx(auVar42,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar43 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar43 = vinsertps_avx(auVar43,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar42 = vsubps_avx(auVar42,*(undefined1 (*) [16])(prim + uVar29 * 0x19 + 6));
  auVar67._0_4_ = fVar103 * auVar42._0_4_;
  auVar67._4_4_ = fVar103 * auVar42._4_4_;
  auVar67._8_4_ = fVar103 * auVar42._8_4_;
  auVar67._12_4_ = fVar103 * auVar42._12_4_;
  auVar49._0_4_ = fVar103 * auVar43._0_4_;
  auVar49._4_4_ = fVar103 * auVar43._4_4_;
  auVar49._8_4_ = fVar103 * auVar43._8_4_;
  auVar49._12_4_ = fVar103 * auVar43._12_4_;
  auVar42 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar29 * 4 + 6)));
  auVar42 = vcvtdq2ps_avx(auVar42);
  auVar43 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar29 * 5 + 6)));
  auVar39 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar29 * 6 + 6)));
  auVar43 = vcvtdq2ps_avx(auVar43);
  auVar39 = vcvtdq2ps_avx(auVar39);
  auVar44 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar29 * 0xb + 6)));
  auVar44 = vcvtdq2ps_avx(auVar44);
  auVar51 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar29 * 0xc + 6)));
  auVar40 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar29 * 0xd + 6)));
  auVar51 = vcvtdq2ps_avx(auVar51);
  auVar40 = vcvtdq2ps_avx(auVar40);
  auVar52 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar29 * 0x12 + 6)));
  auVar52 = vcvtdq2ps_avx(auVar52);
  auVar53 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar29 * 0x13 + 6)));
  auVar41 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar29 * 0x14 + 6)));
  auVar53 = vcvtdq2ps_avx(auVar53);
  auVar41 = vcvtdq2ps_avx(auVar41);
  auVar58._4_4_ = auVar49._0_4_;
  auVar58._0_4_ = auVar49._0_4_;
  auVar58._8_4_ = auVar49._0_4_;
  auVar58._12_4_ = auVar49._0_4_;
  auVar45 = vshufps_avx(auVar49,auVar49,0x55);
  auVar46 = vshufps_avx(auVar49,auVar49,0xaa);
  fVar103 = auVar46._0_4_;
  auVar63._0_4_ = fVar103 * auVar39._0_4_;
  fVar206 = auVar46._4_4_;
  auVar63._4_4_ = fVar206 * auVar39._4_4_;
  fVar195 = auVar46._8_4_;
  auVar63._8_4_ = fVar195 * auVar39._8_4_;
  fVar204 = auVar46._12_4_;
  auVar63._12_4_ = fVar204 * auVar39._12_4_;
  auVar55._0_4_ = auVar40._0_4_ * fVar103;
  auVar55._4_4_ = auVar40._4_4_ * fVar206;
  auVar55._8_4_ = auVar40._8_4_ * fVar195;
  auVar55._12_4_ = auVar40._12_4_ * fVar204;
  auVar50._0_4_ = auVar41._0_4_ * fVar103;
  auVar50._4_4_ = auVar41._4_4_ * fVar206;
  auVar50._8_4_ = auVar41._8_4_ * fVar195;
  auVar50._12_4_ = auVar41._12_4_ * fVar204;
  auVar46 = vfmadd231ps_fma(auVar63,auVar45,auVar43);
  auVar47 = vfmadd231ps_fma(auVar55,auVar45,auVar51);
  auVar45 = vfmadd231ps_fma(auVar50,auVar53,auVar45);
  auVar48 = vfmadd231ps_fma(auVar46,auVar58,auVar42);
  auVar47 = vfmadd231ps_fma(auVar47,auVar58,auVar44);
  auVar49 = vfmadd231ps_fma(auVar45,auVar52,auVar58);
  auVar65._4_4_ = auVar67._0_4_;
  auVar65._0_4_ = auVar67._0_4_;
  auVar65._8_4_ = auVar67._0_4_;
  auVar65._12_4_ = auVar67._0_4_;
  auVar45 = vshufps_avx(auVar67,auVar67,0x55);
  auVar46 = vshufps_avx(auVar67,auVar67,0xaa);
  auVar39 = vmulps_avx512vl(auVar46,auVar39);
  auVar59._0_4_ = auVar46._0_4_ * auVar40._0_4_;
  auVar59._4_4_ = auVar46._4_4_ * auVar40._4_4_;
  auVar59._8_4_ = auVar46._8_4_ * auVar40._8_4_;
  auVar59._12_4_ = auVar46._12_4_ * auVar40._12_4_;
  auVar64._0_4_ = auVar46._0_4_ * auVar41._0_4_;
  auVar64._4_4_ = auVar46._4_4_ * auVar41._4_4_;
  auVar64._8_4_ = auVar46._8_4_ * auVar41._8_4_;
  auVar64._12_4_ = auVar46._12_4_ * auVar41._12_4_;
  auVar40 = vfmadd231ps_avx512vl(auVar39,auVar45,auVar43);
  auVar43 = vfmadd231ps_fma(auVar59,auVar45,auVar51);
  auVar39 = vfmadd231ps_fma(auVar64,auVar45,auVar53);
  auVar41 = vfmadd231ps_avx512vl(auVar40,auVar65,auVar42);
  auVar51 = vfmadd231ps_fma(auVar43,auVar65,auVar44);
  auVar53 = vfmadd231ps_fma(auVar39,auVar65,auVar52);
  auVar42 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar242 = ZEXT1664(auVar42);
  auVar62._8_4_ = 0x219392ef;
  auVar62._0_8_ = 0x219392ef219392ef;
  auVar62._12_4_ = 0x219392ef;
  auVar43 = vandps_avx512vl(auVar48,auVar42);
  uVar34 = vcmpps_avx512vl(auVar43,auVar62,1);
  bVar37 = (bool)((byte)uVar34 & 1);
  auVar46._0_4_ = (uint)bVar37 * 0x219392ef | (uint)!bVar37 * auVar48._0_4_;
  bVar37 = (bool)((byte)(uVar34 >> 1) & 1);
  auVar46._4_4_ = (uint)bVar37 * 0x219392ef | (uint)!bVar37 * auVar48._4_4_;
  bVar37 = (bool)((byte)(uVar34 >> 2) & 1);
  auVar46._8_4_ = (uint)bVar37 * 0x219392ef | (uint)!bVar37 * auVar48._8_4_;
  bVar37 = (bool)((byte)(uVar34 >> 3) & 1);
  auVar46._12_4_ = (uint)bVar37 * 0x219392ef | (uint)!bVar37 * auVar48._12_4_;
  auVar43 = vandps_avx512vl(auVar47,auVar42);
  uVar34 = vcmpps_avx512vl(auVar43,auVar62,1);
  bVar37 = (bool)((byte)uVar34 & 1);
  auVar48._0_4_ = (uint)bVar37 * 0x219392ef | (uint)!bVar37 * auVar47._0_4_;
  bVar37 = (bool)((byte)(uVar34 >> 1) & 1);
  auVar48._4_4_ = (uint)bVar37 * 0x219392ef | (uint)!bVar37 * auVar47._4_4_;
  bVar37 = (bool)((byte)(uVar34 >> 2) & 1);
  auVar48._8_4_ = (uint)bVar37 * 0x219392ef | (uint)!bVar37 * auVar47._8_4_;
  bVar37 = (bool)((byte)(uVar34 >> 3) & 1);
  auVar48._12_4_ = (uint)bVar37 * 0x219392ef | (uint)!bVar37 * auVar47._12_4_;
  auVar42 = vandps_avx512vl(auVar49,auVar42);
  uVar34 = vcmpps_avx512vl(auVar42,auVar62,1);
  bVar37 = (bool)((byte)uVar34 & 1);
  auVar47._0_4_ = (uint)bVar37 * 0x219392ef | (uint)!bVar37 * auVar49._0_4_;
  bVar37 = (bool)((byte)(uVar34 >> 1) & 1);
  auVar47._4_4_ = (uint)bVar37 * 0x219392ef | (uint)!bVar37 * auVar49._4_4_;
  bVar37 = (bool)((byte)(uVar34 >> 2) & 1);
  auVar47._8_4_ = (uint)bVar37 * 0x219392ef | (uint)!bVar37 * auVar49._8_4_;
  bVar37 = (bool)((byte)(uVar34 >> 3) & 1);
  auVar47._12_4_ = (uint)bVar37 * 0x219392ef | (uint)!bVar37 * auVar49._12_4_;
  auVar42 = vrcp14ps_avx512vl(auVar46);
  auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar243 = ZEXT1664(auVar43);
  auVar39 = vfnmadd213ps_avx512vl(auVar46,auVar42,auVar43);
  auVar39 = vfmadd132ps_fma(auVar39,auVar42,auVar42);
  auVar42 = vrcp14ps_avx512vl(auVar48);
  auVar44 = vfnmadd213ps_avx512vl(auVar48,auVar42,auVar43);
  auVar40 = vfmadd132ps_fma(auVar44,auVar42,auVar42);
  auVar42 = vrcp14ps_avx512vl(auVar47);
  auVar43 = vfnmadd213ps_avx512vl(auVar47,auVar42,auVar43);
  auVar52 = vfmadd132ps_fma(auVar43,auVar42,auVar42);
  auVar42._8_8_ = 0;
  auVar42._0_8_ = *(ulong *)(prim + uVar29 * 7 + 6);
  auVar42 = vpmovsxwd_avx(auVar42);
  auVar42 = vcvtdq2ps_avx(auVar42);
  auVar42 = vsubps_avx512vl(auVar42,auVar41);
  auVar70._0_4_ = auVar39._0_4_ * auVar42._0_4_;
  auVar70._4_4_ = auVar39._4_4_ * auVar42._4_4_;
  auVar70._8_4_ = auVar39._8_4_ * auVar42._8_4_;
  auVar70._12_4_ = auVar39._12_4_ * auVar42._12_4_;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = *(ulong *)(prim + uVar29 * 9 + 6);
  auVar42 = vpmovsxwd_avx(auVar43);
  auVar42 = vcvtdq2ps_avx(auVar42);
  auVar42 = vsubps_avx512vl(auVar42,auVar41);
  auVar61._0_4_ = auVar39._0_4_ * auVar42._0_4_;
  auVar61._4_4_ = auVar39._4_4_ * auVar42._4_4_;
  auVar61._8_4_ = auVar39._8_4_ * auVar42._8_4_;
  auVar61._12_4_ = auVar39._12_4_ * auVar42._12_4_;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = *(ulong *)(prim + uVar29 * 0xe + 6);
  auVar42 = vpmovsxwd_avx(auVar39);
  auVar42 = vcvtdq2ps_avx(auVar42);
  auVar42 = vsubps_avx(auVar42,auVar51);
  auVar57._0_4_ = auVar40._0_4_ * auVar42._0_4_;
  auVar57._4_4_ = auVar40._4_4_ * auVar42._4_4_;
  auVar57._8_4_ = auVar40._8_4_ * auVar42._8_4_;
  auVar57._12_4_ = auVar40._12_4_ * auVar42._12_4_;
  auVar39 = vpbroadcastd_avx512vl();
  auVar44._8_8_ = 0;
  auVar44._0_8_ = *(ulong *)(prim + (ulong)(byte)prim[1] * 0x10 + 6);
  auVar42 = vpmovsxwd_avx(auVar44);
  auVar42 = vcvtdq2ps_avx(auVar42);
  auVar43 = vsubps_avx(auVar42,auVar51);
  auVar51._8_8_ = 0;
  auVar51._0_8_ = *(ulong *)(prim + uVar29 * 0x15 + 6);
  auVar42 = vpmovsxwd_avx(auVar51);
  auVar56._0_4_ = auVar40._0_4_ * auVar43._0_4_;
  auVar56._4_4_ = auVar40._4_4_ * auVar43._4_4_;
  auVar56._8_4_ = auVar40._8_4_ * auVar43._8_4_;
  auVar56._12_4_ = auVar40._12_4_ * auVar43._12_4_;
  auVar42 = vcvtdq2ps_avx(auVar42);
  auVar42 = vsubps_avx(auVar42,auVar53);
  auVar60._0_4_ = auVar52._0_4_ * auVar42._0_4_;
  auVar60._4_4_ = auVar52._4_4_ * auVar42._4_4_;
  auVar60._8_4_ = auVar52._8_4_ * auVar42._8_4_;
  auVar60._12_4_ = auVar52._12_4_ * auVar42._12_4_;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = *(ulong *)(prim + uVar29 * 0x17 + 6);
  auVar42 = vpmovsxwd_avx(auVar40);
  auVar42 = vcvtdq2ps_avx(auVar42);
  auVar42 = vsubps_avx(auVar42,auVar53);
  auVar54._0_4_ = auVar52._0_4_ * auVar42._0_4_;
  auVar54._4_4_ = auVar52._4_4_ * auVar42._4_4_;
  auVar54._8_4_ = auVar52._8_4_ * auVar42._8_4_;
  auVar54._12_4_ = auVar52._12_4_ * auVar42._12_4_;
  auVar42 = vpminsd_avx(auVar70,auVar61);
  auVar43 = vpminsd_avx(auVar57,auVar56);
  auVar42 = vmaxps_avx(auVar42,auVar43);
  auVar43 = vpminsd_avx(auVar60,auVar54);
  uVar109 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar52._4_4_ = uVar109;
  auVar52._0_4_ = uVar109;
  auVar52._8_4_ = uVar109;
  auVar52._12_4_ = uVar109;
  auVar43 = vmaxps_avx512vl(auVar43,auVar52);
  auVar42 = vmaxps_avx(auVar42,auVar43);
  auVar53._8_4_ = 0x3f7ffffa;
  auVar53._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar53._12_4_ = 0x3f7ffffa;
  local_3f0 = vmulps_avx512vl(auVar42,auVar53);
  auVar42 = vpmaxsd_avx(auVar70,auVar61);
  auVar43 = vpmaxsd_avx(auVar57,auVar56);
  auVar42 = vminps_avx(auVar42,auVar43);
  auVar43 = vpmaxsd_avx(auVar60,auVar54);
  uVar109 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar41._4_4_ = uVar109;
  auVar41._0_4_ = uVar109;
  auVar41._8_4_ = uVar109;
  auVar41._12_4_ = uVar109;
  auVar43 = vminps_avx512vl(auVar43,auVar41);
  auVar42 = vminps_avx(auVar42,auVar43);
  auVar45._8_4_ = 0x3f800003;
  auVar45._0_8_ = 0x3f8000033f800003;
  auVar45._12_4_ = 0x3f800003;
  auVar42 = vmulps_avx512vl(auVar42,auVar45);
  uVar14 = vcmpps_avx512vl(local_3f0,auVar42,2);
  uVar15 = vpcmpgtd_avx512vl(auVar39,_DAT_01f4ad30);
  uVar34 = CONCAT44((int)((ulong)in_R11 >> 0x20),(uint)((byte)uVar14 & 0xf & (byte)uVar15));
  local_220 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar42 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar237 = ZEXT1664(auVar42);
  auVar42 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar238 = ZEXT1664(auVar42);
  auVar245 = ZEXT464(0x3f800000);
  auVar42 = vxorps_avx512vl(in_ZMM29._0_16_,in_ZMM29._0_16_);
  auVar244 = ZEXT1664(auVar42);
LAB_017df73f:
  if (uVar34 == 0) {
    return;
  }
  lVar31 = 0;
  for (uVar29 = uVar34; (uVar29 & 1) == 0; uVar29 = uVar29 >> 1 | 0x8000000000000000) {
    lVar31 = lVar31 + 1;
  }
  uVar4 = *(uint *)(prim + 2);
  uVar5 = *(uint *)(prim + lVar31 * 4 + 6);
  pGVar7 = (context->scene->geometries).items[uVar4].ptr;
  lVar8 = *(long *)&pGVar7[1].time_range.upper;
  uVar29 = (ulong)*(uint *)(*(long *)&pGVar7->field_0x58 +
                           (ulong)uVar5 *
                           pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  auVar42 = *(undefined1 (*) [16])(lVar8 + (long)pGVar7[1].intersectionFilterN * uVar29);
  lVar31 = uVar29 + 1;
  auVar43 = *(undefined1 (*) [16])(lVar8 + (long)pGVar7[1].intersectionFilterN * lVar31);
  _Var9 = pGVar7[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar39 = *(undefined1 (*) [16])(_Var9 + (long)pGVar7[2].userPtr * uVar29);
  auVar44 = *(undefined1 (*) [16])(_Var9 + (long)pGVar7[2].userPtr * lVar31);
  auVar51 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar51 = vinsertps_avx(auVar51,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  fVar103 = *(float *)(ray + k * 4 + 0x60);
  auVar45 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaab));
  auVar41 = vfmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        (pGVar7[2].intersectionFilterN + (long)pGVar7[2].pointQueryFunc * uVar29),
                       auVar42,auVar45);
  auVar46 = vfnmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        (pGVar7[2].intersectionFilterN + (long)pGVar7[2].pointQueryFunc * lVar31),
                       auVar43,auVar45);
  auVar47 = vfmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        ((long)pGVar7[3].userPtr + uVar29 * *(long *)&pGVar7[3].fnumTimeSegments),
                       auVar39,auVar45);
  auVar48 = vfnmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        ((long)pGVar7[3].userPtr + *(long *)&pGVar7[3].fnumTimeSegments * lVar31),
                       auVar44,auVar45);
  auVar54 = ZEXT816(0) << 0x40;
  auVar69._0_4_ = auVar43._0_4_ * 0.0;
  auVar69._4_4_ = auVar43._4_4_ * 0.0;
  auVar69._8_4_ = auVar43._8_4_ * 0.0;
  auVar69._12_4_ = auVar43._12_4_ * 0.0;
  auVar52 = vfmadd231ps_fma(auVar69,auVar46,auVar54);
  auVar40 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar41,auVar52);
  auVar117._0_4_ = auVar42._0_4_ + auVar40._0_4_;
  auVar117._4_4_ = auVar42._4_4_ + auVar40._4_4_;
  auVar117._8_4_ = auVar42._8_4_ + auVar40._8_4_;
  auVar117._12_4_ = auVar42._12_4_ + auVar40._12_4_;
  auVar55 = auVar237._0_16_;
  auVar40 = vfmadd231ps_avx512vl(auVar52,auVar41,auVar55);
  auVar49 = vfnmadd231ps_avx512vl(auVar40,auVar42,auVar55);
  auVar208._0_4_ = auVar44._0_4_ * 0.0;
  auVar208._4_4_ = auVar44._4_4_ * 0.0;
  auVar208._8_4_ = auVar44._8_4_ * 0.0;
  auVar208._12_4_ = auVar44._12_4_ * 0.0;
  auVar52 = vfmadd231ps_fma(auVar208,auVar48,auVar54);
  auVar40 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar47,auVar52);
  auVar222._0_4_ = auVar39._0_4_ + auVar40._0_4_;
  auVar222._4_4_ = auVar39._4_4_ + auVar40._4_4_;
  auVar222._8_4_ = auVar39._8_4_ + auVar40._8_4_;
  auVar222._12_4_ = auVar39._12_4_ + auVar40._12_4_;
  auVar40 = vfmadd231ps_avx512vl(auVar52,auVar47,auVar55);
  auVar50 = vfnmadd231ps_avx512vl(auVar40,auVar39,auVar55);
  auVar40 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar46,auVar43);
  auVar40 = vfmadd231ps_fma(auVar40,auVar41,auVar54);
  auVar53 = vfmadd231ps_fma(auVar40,auVar42,auVar54);
  auVar43 = vmulps_avx512vl(auVar43,auVar55);
  auVar43 = vfnmadd231ps_avx512vl(auVar43,auVar55,auVar46);
  auVar43 = vfmadd231ps_fma(auVar43,auVar54,auVar41);
  auVar41 = vfnmadd231ps_fma(auVar43,auVar54,auVar42);
  auVar42 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar48,auVar44);
  auVar42 = vfmadd231ps_fma(auVar42,auVar47,auVar54);
  auVar40 = vfmadd231ps_fma(auVar42,auVar39,auVar54);
  auVar42 = vmulps_avx512vl(auVar44,auVar55);
  auVar42 = vfnmadd231ps_avx512vl(auVar42,auVar55,auVar48);
  auVar42 = vfmadd231ps_fma(auVar42,auVar54,auVar47);
  auVar52 = vfnmadd231ps_fma(auVar42,auVar54,auVar39);
  auVar42 = vshufps_avx(auVar49,auVar49,0xc9);
  auVar43 = vshufps_avx(auVar222,auVar222,0xc9);
  fVar108 = auVar49._0_4_;
  auVar159._0_4_ = fVar108 * auVar43._0_4_;
  fVar114 = auVar49._4_4_;
  auVar159._4_4_ = fVar114 * auVar43._4_4_;
  fVar115 = auVar49._8_4_;
  auVar159._8_4_ = fVar115 * auVar43._8_4_;
  fVar116 = auVar49._12_4_;
  auVar159._12_4_ = fVar116 * auVar43._12_4_;
  auVar43 = vfmsub231ps_fma(auVar159,auVar42,auVar222);
  auVar39 = vshufps_avx(auVar43,auVar43,0xc9);
  auVar43 = vshufps_avx(auVar50,auVar50,0xc9);
  auVar178._0_4_ = auVar43._0_4_ * fVar108;
  auVar178._4_4_ = auVar43._4_4_ * fVar114;
  auVar178._8_4_ = auVar43._8_4_ * fVar115;
  auVar178._12_4_ = auVar43._12_4_ * fVar116;
  auVar42 = vfmsub231ps_fma(auVar178,auVar42,auVar50);
  auVar44 = vshufps_avx(auVar42,auVar42,0xc9);
  auVar42 = vshufps_avx(auVar41,auVar41,0xc9);
  auVar43 = vshufps_avx(auVar40,auVar40,0xc9);
  fVar206 = auVar41._0_4_;
  auVar188._0_4_ = auVar43._0_4_ * fVar206;
  fVar195 = auVar41._4_4_;
  auVar188._4_4_ = auVar43._4_4_ * fVar195;
  fVar204 = auVar41._8_4_;
  auVar188._8_4_ = auVar43._8_4_ * fVar204;
  fVar205 = auVar41._12_4_;
  auVar188._12_4_ = auVar43._12_4_ * fVar205;
  auVar43 = vfmsub231ps_fma(auVar188,auVar42,auVar40);
  auVar40 = vshufps_avx(auVar43,auVar43,0xc9);
  auVar43 = vshufps_avx(auVar52,auVar52,0xc9);
  auVar189._0_4_ = auVar43._0_4_ * fVar206;
  auVar189._4_4_ = auVar43._4_4_ * fVar195;
  auVar189._8_4_ = auVar43._8_4_ * fVar204;
  auVar189._12_4_ = auVar43._12_4_ * fVar205;
  auVar42 = vfmsub231ps_fma(auVar189,auVar42,auVar52);
  auVar52 = vshufps_avx(auVar42,auVar42,0xc9);
  auVar42 = vdpps_avx(auVar39,auVar39,0x7f);
  fVar133 = auVar42._0_4_;
  auVar190._4_12_ = ZEXT812(0) << 0x20;
  auVar190._0_4_ = fVar133;
  auVar43 = vrsqrt14ss_avx512f(auVar54,auVar190);
  auVar46 = vmulss_avx512f(auVar43,ZEXT416(0x3fc00000));
  auVar47 = vmulss_avx512f(auVar42,ZEXT416(0x3f000000));
  fVar138 = auVar43._0_4_;
  fVar139 = auVar46._0_4_ - auVar47._0_4_ * fVar138 * fVar138 * fVar138;
  auVar43 = vdpps_avx(auVar39,auVar44,0x7f);
  fVar221 = fVar139 * auVar39._0_4_;
  fVar226 = fVar139 * auVar39._4_4_;
  fVar227 = fVar139 * auVar39._8_4_;
  fVar228 = fVar139 * auVar39._12_4_;
  auVar179._0_4_ = fVar133 * auVar44._0_4_;
  auVar179._4_4_ = fVar133 * auVar44._4_4_;
  auVar179._8_4_ = fVar133 * auVar44._8_4_;
  auVar179._12_4_ = fVar133 * auVar44._12_4_;
  fVar133 = auVar43._0_4_;
  auVar160._0_4_ = fVar133 * auVar39._0_4_;
  auVar160._4_4_ = fVar133 * auVar39._4_4_;
  auVar160._8_4_ = fVar133 * auVar39._8_4_;
  auVar160._12_4_ = fVar133 * auVar39._12_4_;
  auVar39 = vsubps_avx(auVar179,auVar160);
  auVar43 = vrcp14ss_avx512f(auVar54,auVar190);
  auVar42 = vfnmadd213ss_avx512f(auVar42,auVar43,ZEXT416(0x40000000));
  fVar133 = auVar43._0_4_ * auVar42._0_4_;
  auVar42 = vdpps_avx(auVar40,auVar40,0x7f);
  fVar138 = auVar42._0_4_;
  auVar180._4_12_ = ZEXT812(0) << 0x20;
  auVar180._0_4_ = fVar138;
  auVar43 = vrsqrt14ss_avx512f(auVar54,auVar180);
  auVar44 = vmulss_avx512f(auVar43,ZEXT416(0x3fc00000));
  auVar46 = vmulss_avx512f(auVar42,ZEXT416(0x3f000000));
  fVar148 = auVar43._0_4_;
  fVar148 = auVar44._0_4_ - auVar46._0_4_ * fVar148 * fVar148 * fVar148;
  auVar43 = vdpps_avx(auVar40,auVar52,0x7f);
  fVar207 = fVar148 * auVar40._0_4_;
  fVar218 = fVar148 * auVar40._4_4_;
  fVar219 = fVar148 * auVar40._8_4_;
  fVar220 = fVar148 * auVar40._12_4_;
  auVar149._0_4_ = fVar138 * auVar52._0_4_;
  auVar149._4_4_ = fVar138 * auVar52._4_4_;
  auVar149._8_4_ = fVar138 * auVar52._8_4_;
  auVar149._12_4_ = fVar138 * auVar52._12_4_;
  fVar138 = auVar43._0_4_;
  auVar140._0_4_ = fVar138 * auVar40._0_4_;
  auVar140._4_4_ = fVar138 * auVar40._4_4_;
  auVar140._8_4_ = fVar138 * auVar40._8_4_;
  auVar140._12_4_ = fVar138 * auVar40._12_4_;
  auVar44 = vsubps_avx(auVar149,auVar140);
  auVar43 = vrcp14ss_avx512f(auVar54,auVar180);
  auVar42 = vfnmadd213ss_avx512f(auVar42,auVar43,ZEXT416(0x40000000));
  fVar138 = auVar42._0_4_ * auVar43._0_4_;
  auVar42 = vshufps_avx(auVar117,auVar117,0xff);
  auVar166._0_4_ = fVar221 * auVar42._0_4_;
  auVar166._4_4_ = fVar226 * auVar42._4_4_;
  auVar166._8_4_ = fVar227 * auVar42._8_4_;
  auVar166._12_4_ = fVar228 * auVar42._12_4_;
  local_330 = vsubps_avx(auVar117,auVar166);
  auVar43 = vshufps_avx(auVar49,auVar49,0xff);
  auVar150._0_4_ = auVar43._0_4_ * fVar221 + auVar42._0_4_ * fVar139 * fVar133 * auVar39._0_4_;
  auVar150._4_4_ = auVar43._4_4_ * fVar226 + auVar42._4_4_ * fVar139 * fVar133 * auVar39._4_4_;
  auVar150._8_4_ = auVar43._8_4_ * fVar227 + auVar42._8_4_ * fVar139 * fVar133 * auVar39._8_4_;
  auVar150._12_4_ = auVar43._12_4_ * fVar228 + auVar42._12_4_ * fVar139 * fVar133 * auVar39._12_4_;
  auVar39 = vsubps_avx(auVar49,auVar150);
  local_340._0_4_ = auVar166._0_4_ + auVar117._0_4_;
  local_340._4_4_ = auVar166._4_4_ + auVar117._4_4_;
  fStack_338 = auVar166._8_4_ + auVar117._8_4_;
  fStack_334 = auVar166._12_4_ + auVar117._12_4_;
  auVar110._0_4_ = fVar108 + auVar150._0_4_;
  auVar110._4_4_ = fVar114 + auVar150._4_4_;
  auVar110._8_4_ = fVar115 + auVar150._8_4_;
  auVar110._12_4_ = fVar116 + auVar150._12_4_;
  auVar42 = vshufps_avx(auVar53,auVar53,0xff);
  auVar151._0_4_ = fVar207 * auVar42._0_4_;
  auVar151._4_4_ = fVar218 * auVar42._4_4_;
  auVar151._8_4_ = fVar219 * auVar42._8_4_;
  auVar151._12_4_ = fVar220 * auVar42._12_4_;
  local_350 = vsubps_avx(auVar53,auVar151);
  auVar43 = vshufps_avx(auVar41,auVar41,0xff);
  auVar118._0_4_ = auVar43._0_4_ * fVar207 + auVar42._0_4_ * fVar148 * auVar44._0_4_ * fVar138;
  auVar118._4_4_ = auVar43._4_4_ * fVar218 + auVar42._4_4_ * fVar148 * auVar44._4_4_ * fVar138;
  auVar118._8_4_ = auVar43._8_4_ * fVar219 + auVar42._8_4_ * fVar148 * auVar44._8_4_ * fVar138;
  auVar118._12_4_ = auVar43._12_4_ * fVar220 + auVar42._12_4_ * fVar148 * auVar44._12_4_ * fVar138;
  auVar42 = vsubps_avx(auVar41,auVar118);
  _local_360 = vaddps_avx512vl(auVar53,auVar151);
  auVar119._0_4_ = fVar206 + auVar118._0_4_;
  auVar119._4_4_ = fVar195 + auVar118._4_4_;
  auVar119._8_4_ = fVar204 + auVar118._8_4_;
  auVar119._12_4_ = fVar205 + auVar118._12_4_;
  auVar43 = vmulps_avx512vl(auVar39,auVar45);
  local_370 = vaddps_avx512vl(local_330,auVar43);
  auVar42 = vmulps_avx512vl(auVar42,auVar45);
  local_380 = vsubps_avx512vl(local_350,auVar42);
  auVar42 = vmulps_avx512vl(auVar110,auVar45);
  _local_390 = vaddps_avx512vl(_local_340,auVar42);
  auVar42 = vmulps_avx512vl(auVar119,auVar45);
  _local_3a0 = vsubps_avx512vl(_local_360,auVar42);
  local_2b0 = vsubps_avx(local_330,auVar51);
  uVar109 = local_2b0._0_4_;
  auVar120._4_4_ = uVar109;
  auVar120._0_4_ = uVar109;
  auVar120._8_4_ = uVar109;
  auVar120._12_4_ = uVar109;
  auVar42 = vshufps_avx(local_2b0,local_2b0,0x55);
  auVar43 = vshufps_avx(local_2b0,local_2b0,0xaa);
  aVar2 = pre->ray_space[k].vx.field_0;
  aVar3 = pre->ray_space[k].vy.field_0;
  fVar206 = pre->ray_space[k].vz.field_0.m128[0];
  fVar195 = pre->ray_space[k].vz.field_0.m128[1];
  fVar204 = pre->ray_space[k].vz.field_0.m128[2];
  fVar205 = pre->ray_space[k].vz.field_0.m128[3];
  auVar111._0_4_ = fVar206 * auVar43._0_4_;
  auVar111._4_4_ = fVar195 * auVar43._4_4_;
  auVar111._8_4_ = fVar204 * auVar43._8_4_;
  auVar111._12_4_ = fVar205 * auVar43._12_4_;
  auVar42 = vfmadd231ps_fma(auVar111,(undefined1  [16])aVar3,auVar42);
  auVar52 = vfmadd231ps_fma(auVar42,(undefined1  [16])aVar2,auVar120);
  local_2c0 = vsubps_avx512vl(local_370,auVar51);
  uVar109 = local_2c0._0_4_;
  auVar126._4_4_ = uVar109;
  auVar126._0_4_ = uVar109;
  auVar126._8_4_ = uVar109;
  auVar126._12_4_ = uVar109;
  auVar42 = vshufps_avx(local_2c0,local_2c0,0x55);
  auVar43 = vshufps_avx(local_2c0,local_2c0,0xaa);
  auVar121._0_4_ = fVar206 * auVar43._0_4_;
  auVar121._4_4_ = fVar195 * auVar43._4_4_;
  auVar121._8_4_ = fVar204 * auVar43._8_4_;
  auVar121._12_4_ = fVar205 * auVar43._12_4_;
  auVar42 = vfmadd231ps_fma(auVar121,(undefined1  [16])aVar3,auVar42);
  auVar53 = vfmadd231ps_fma(auVar42,(undefined1  [16])aVar2,auVar126);
  local_2d0 = vsubps_avx512vl(local_380,auVar51);
  uVar109 = local_2d0._0_4_;
  auVar152._4_4_ = uVar109;
  auVar152._0_4_ = uVar109;
  auVar152._8_4_ = uVar109;
  auVar152._12_4_ = uVar109;
  auVar42 = vshufps_avx(local_2d0,local_2d0,0x55);
  auVar43 = vshufps_avx(local_2d0,local_2d0,0xaa);
  auVar127._0_4_ = fVar206 * auVar43._0_4_;
  auVar127._4_4_ = fVar195 * auVar43._4_4_;
  auVar127._8_4_ = fVar204 * auVar43._8_4_;
  auVar127._12_4_ = fVar205 * auVar43._12_4_;
  auVar42 = vfmadd231ps_fma(auVar127,(undefined1  [16])aVar3,auVar42);
  auVar41 = vfmadd231ps_fma(auVar42,(undefined1  [16])aVar2,auVar152);
  local_2e0 = vsubps_avx(local_350,auVar51);
  uVar109 = local_2e0._0_4_;
  auVar167._4_4_ = uVar109;
  auVar167._0_4_ = uVar109;
  auVar167._8_4_ = uVar109;
  auVar167._12_4_ = uVar109;
  auVar42 = vshufps_avx(local_2e0,local_2e0,0x55);
  auVar43 = vshufps_avx(local_2e0,local_2e0,0xaa);
  auVar153._0_4_ = fVar206 * auVar43._0_4_;
  auVar153._4_4_ = fVar195 * auVar43._4_4_;
  auVar153._8_4_ = fVar204 * auVar43._8_4_;
  auVar153._12_4_ = fVar205 * auVar43._12_4_;
  auVar42 = vfmadd231ps_fma(auVar153,(undefined1  [16])aVar3,auVar42);
  auVar45 = vfmadd231ps_fma(auVar42,(undefined1  [16])aVar2,auVar167);
  local_2f0 = vsubps_avx(_local_340,auVar51);
  uVar109 = local_2f0._0_4_;
  auVar168._4_4_ = uVar109;
  auVar168._0_4_ = uVar109;
  auVar168._8_4_ = uVar109;
  auVar168._12_4_ = uVar109;
  auVar42 = vshufps_avx(local_2f0,local_2f0,0x55);
  auVar43 = vshufps_avx(local_2f0,local_2f0,0xaa);
  auVar191._0_4_ = auVar43._0_4_ * fVar206;
  auVar191._4_4_ = auVar43._4_4_ * fVar195;
  auVar191._8_4_ = auVar43._8_4_ * fVar204;
  auVar191._12_4_ = auVar43._12_4_ * fVar205;
  auVar42 = vfmadd231ps_fma(auVar191,(undefined1  [16])aVar3,auVar42);
  auVar46 = vfmadd231ps_fma(auVar42,(undefined1  [16])aVar2,auVar168);
  local_300 = vsubps_avx512vl(_local_390,auVar51);
  uVar109 = local_300._0_4_;
  auVar169._4_4_ = uVar109;
  auVar169._0_4_ = uVar109;
  auVar169._8_4_ = uVar109;
  auVar169._12_4_ = uVar109;
  auVar42 = vshufps_avx(local_300,local_300,0x55);
  auVar43 = vshufps_avx(local_300,local_300,0xaa);
  auVar196._0_4_ = auVar43._0_4_ * fVar206;
  auVar196._4_4_ = auVar43._4_4_ * fVar195;
  auVar196._8_4_ = auVar43._8_4_ * fVar204;
  auVar196._12_4_ = auVar43._12_4_ * fVar205;
  auVar42 = vfmadd231ps_fma(auVar196,(undefined1  [16])aVar3,auVar42);
  auVar47 = vfmadd231ps_fma(auVar42,(undefined1  [16])aVar2,auVar169);
  local_310 = vsubps_avx512vl(_local_3a0,auVar51);
  uVar109 = local_310._0_4_;
  auVar170._4_4_ = uVar109;
  auVar170._0_4_ = uVar109;
  auVar170._8_4_ = uVar109;
  auVar170._12_4_ = uVar109;
  auVar42 = vshufps_avx(local_310,local_310,0x55);
  auVar43 = vshufps_avx(local_310,local_310,0xaa);
  auVar209._0_4_ = auVar43._0_4_ * fVar206;
  auVar209._4_4_ = auVar43._4_4_ * fVar195;
  auVar209._8_4_ = auVar43._8_4_ * fVar204;
  auVar209._12_4_ = auVar43._12_4_ * fVar205;
  auVar42 = vfmadd231ps_fma(auVar209,(undefined1  [16])aVar3,auVar42);
  auVar48 = vfmadd231ps_fma(auVar42,(undefined1  [16])aVar2,auVar170);
  local_320 = vsubps_avx512vl(_local_360,auVar51);
  uVar109 = local_320._0_4_;
  auVar68._4_4_ = uVar109;
  auVar68._0_4_ = uVar109;
  auVar68._8_4_ = uVar109;
  auVar68._12_4_ = uVar109;
  auVar42 = vshufps_avx(local_320,local_320,0x55);
  auVar43 = vshufps_avx(local_320,local_320,0xaa);
  auVar161._0_4_ = auVar43._0_4_ * fVar206;
  auVar161._4_4_ = auVar43._4_4_ * fVar195;
  auVar161._8_4_ = auVar43._8_4_ * fVar204;
  auVar161._12_4_ = auVar43._12_4_ * fVar205;
  auVar42 = vfmadd231ps_fma(auVar161,(undefined1  [16])aVar3,auVar42);
  auVar49 = vfmadd231ps_fma(auVar42,(undefined1  [16])aVar2,auVar68);
  auVar39 = vmovlhps_avx(auVar52,auVar46);
  auVar44 = vmovlhps_avx(auVar53,auVar47);
  auVar40 = vmovlhps_avx512f(auVar41,auVar48);
  _local_290 = vmovlhps_avx512f(auVar45,auVar49);
  auVar43 = vminps_avx(auVar39,auVar44);
  auVar42 = vmaxps_avx(auVar39,auVar44);
  auVar51 = vminps_avx512vl(auVar40,_local_290);
  auVar43 = vminps_avx(auVar43,auVar51);
  auVar51 = vmaxps_avx512vl(auVar40,_local_290);
  auVar42 = vmaxps_avx(auVar42,auVar51);
  auVar51 = vshufpd_avx(auVar43,auVar43,3);
  auVar43 = vminps_avx(auVar43,auVar51);
  auVar51 = vshufpd_avx(auVar42,auVar42,3);
  auVar42 = vmaxps_avx(auVar42,auVar51);
  auVar43 = vandps_avx512vl(auVar43,auVar242._0_16_);
  auVar42 = vandps_avx512vl(auVar42,auVar242._0_16_);
  auVar42 = vmaxps_avx(auVar43,auVar42);
  auVar43 = vmovshdup_avx(auVar42);
  auVar42 = vmaxss_avx(auVar43,auVar42);
  local_468 = (uint)uVar34 + 0xf;
  auVar51 = vmovddup_avx512vl(auVar52);
  auVar52 = vmovddup_avx512vl(auVar53);
  auVar53 = vmovddup_avx512vl(auVar41);
  auVar112._8_8_ = auVar45._0_8_;
  auVar112._0_8_ = auVar45._0_8_;
  local_2a0 = ZEXT416((uint)(auVar42._0_4_ * 9.536743e-07));
  local_260 = vbroadcastss_avx512vl(local_2a0);
  auVar42 = vxorps_avx512vl(local_260._0_16_,auVar238._0_16_);
  local_1c0 = auVar42._0_4_;
  uStack_1bc = local_1c0;
  uStack_1b8 = local_1c0;
  uStack_1b4 = local_1c0;
  uStack_1b0 = local_1c0;
  uStack_1ac = local_1c0;
  uStack_1a8 = local_1c0;
  uStack_1a4 = local_1c0;
  uVar29 = 0;
  auVar42 = vsubps_avx(auVar44,auVar39);
  local_270 = vsubps_avx512vl(auVar40,auVar44);
  local_280 = vsubps_avx512vl(_local_290,auVar40);
  local_3b0 = vsubps_avx(_local_340,local_330);
  local_3c0 = vsubps_avx512vl(_local_390,local_370);
  local_3d0 = vsubps_avx512vl(_local_3a0,local_380);
  _local_3e0 = vsubps_avx512vl(_local_360,local_350);
  local_1e0 = vpbroadcastd_avx512vl();
  local_200 = vpbroadcastd_avx512vl();
  auVar43 = ZEXT816(0x3f80000000000000);
  auVar66 = auVar43;
LAB_017dfe45:
  do {
    auVar41 = vshufps_avx(auVar66,auVar66,0x50);
    auVar229._8_4_ = 0x3f800000;
    auVar229._0_8_ = 0x3f8000003f800000;
    auVar229._12_4_ = 0x3f800000;
    auVar91._16_4_ = 0x3f800000;
    auVar91._0_16_ = auVar229;
    auVar91._20_4_ = 0x3f800000;
    auVar91._24_4_ = 0x3f800000;
    auVar91._28_4_ = 0x3f800000;
    auVar45 = vsubps_avx(auVar229,auVar41);
    fVar206 = auVar41._0_4_;
    fVar133 = auVar46._0_4_;
    auVar134._0_4_ = fVar133 * fVar206;
    fVar195 = auVar41._4_4_;
    fVar138 = auVar46._4_4_;
    auVar134._4_4_ = fVar138 * fVar195;
    fVar204 = auVar41._8_4_;
    auVar134._8_4_ = fVar133 * fVar204;
    fVar205 = auVar41._12_4_;
    auVar134._12_4_ = fVar138 * fVar205;
    fVar139 = auVar47._0_4_;
    auVar141._0_4_ = fVar139 * fVar206;
    fVar148 = auVar47._4_4_;
    auVar141._4_4_ = fVar148 * fVar195;
    auVar141._8_4_ = fVar139 * fVar204;
    auVar141._12_4_ = fVar148 * fVar205;
    fVar108 = auVar48._0_4_;
    auVar154._0_4_ = fVar108 * fVar206;
    fVar114 = auVar48._4_4_;
    auVar154._4_4_ = fVar114 * fVar195;
    auVar154._8_4_ = fVar108 * fVar204;
    auVar154._12_4_ = fVar114 * fVar205;
    fVar115 = auVar49._0_4_;
    auVar122._0_4_ = fVar115 * fVar206;
    fVar116 = auVar49._4_4_;
    auVar122._4_4_ = fVar116 * fVar195;
    auVar122._8_4_ = fVar115 * fVar204;
    auVar122._12_4_ = fVar116 * fVar205;
    auVar50 = vfmadd231ps_avx512vl(auVar134,auVar45,auVar51);
    auVar54 = vfmadd231ps_avx512vl(auVar141,auVar45,auVar52);
    auVar55 = vfmadd231ps_avx512vl(auVar154,auVar45,auVar53);
    auVar45 = vfmadd231ps_fma(auVar122,auVar112,auVar45);
    auVar41 = vmovshdup_avx(auVar43);
    fVar195 = auVar43._0_4_;
    fVar206 = (auVar41._0_4_ - fVar195) * 0.04761905;
    auVar85._4_4_ = fVar195;
    auVar85._0_4_ = fVar195;
    auVar85._8_4_ = fVar195;
    auVar85._12_4_ = fVar195;
    auVar85._16_4_ = fVar195;
    auVar85._20_4_ = fVar195;
    auVar85._24_4_ = fVar195;
    auVar85._28_4_ = fVar195;
    auVar75._0_8_ = auVar41._0_8_;
    auVar75._8_8_ = auVar75._0_8_;
    auVar75._16_8_ = auVar75._0_8_;
    auVar75._24_8_ = auVar75._0_8_;
    auVar88 = vsubps_avx(auVar75,auVar85);
    uVar109 = auVar50._0_4_;
    auVar89._4_4_ = uVar109;
    auVar89._0_4_ = uVar109;
    auVar89._8_4_ = uVar109;
    auVar89._12_4_ = uVar109;
    auVar89._16_4_ = uVar109;
    auVar89._20_4_ = uVar109;
    auVar89._24_4_ = uVar109;
    auVar89._28_4_ = uVar109;
    auVar77._8_4_ = 1;
    auVar77._0_8_ = 0x100000001;
    auVar77._12_4_ = 1;
    auVar77._16_4_ = 1;
    auVar77._20_4_ = 1;
    auVar77._24_4_ = 1;
    auVar77._28_4_ = 1;
    auVar87 = ZEXT1632(auVar50);
    auVar86 = vpermps_avx2(auVar77,auVar87);
    auVar71 = vbroadcastss_avx512vl(auVar54);
    auVar81 = ZEXT1632(auVar54);
    auVar72 = vpermps_avx512vl(auVar77,auVar81);
    auVar73 = vbroadcastss_avx512vl(auVar55);
    auVar82 = ZEXT1632(auVar55);
    auVar74 = vpermps_avx512vl(auVar77,auVar82);
    auVar75 = vbroadcastss_avx512vl(auVar45);
    auVar84 = ZEXT1632(auVar45);
    auVar76 = vpermps_avx512vl(auVar77,auVar84);
    auVar90._4_4_ = fVar206;
    auVar90._0_4_ = fVar206;
    auVar90._8_4_ = fVar206;
    auVar90._12_4_ = fVar206;
    auVar90._16_4_ = fVar206;
    auVar90._20_4_ = fVar206;
    auVar90._24_4_ = fVar206;
    auVar90._28_4_ = fVar206;
    auVar83._8_4_ = 2;
    auVar83._0_8_ = 0x200000002;
    auVar83._12_4_ = 2;
    auVar83._16_4_ = 2;
    auVar83._20_4_ = 2;
    auVar83._24_4_ = 2;
    auVar83._28_4_ = 2;
    auVar77 = vpermps_avx512vl(auVar83,auVar87);
    auVar78 = vbroadcastss_avx512vl(ZEXT416(3));
    auVar79 = vpermps_avx512vl(auVar78,auVar87);
    auVar80 = vpermps_avx512vl(auVar83,auVar81);
    auVar81 = vpermps_avx512vl(auVar78,auVar81);
    auVar87 = vpermps_avx2(auVar83,auVar82);
    auVar82 = vpermps_avx512vl(auVar78,auVar82);
    auVar83 = vpermps_avx512vl(auVar83,auVar84);
    auVar78 = vpermps_avx512vl(auVar78,auVar84);
    auVar41 = vfmadd132ps_fma(auVar88,auVar85,_DAT_01f7b040);
    auVar88 = vsubps_avx(auVar91,ZEXT1632(auVar41));
    auVar84 = vmulps_avx512vl(auVar71,ZEXT1632(auVar41));
    auVar91 = ZEXT1632(auVar41);
    auVar85 = vmulps_avx512vl(auVar72,auVar91);
    auVar45 = vfmadd231ps_fma(auVar84,auVar88,auVar89);
    auVar50 = vfmadd231ps_fma(auVar85,auVar88,auVar86);
    auVar84 = vmulps_avx512vl(auVar73,auVar91);
    auVar85 = vmulps_avx512vl(auVar74,auVar91);
    auVar84 = vfmadd231ps_avx512vl(auVar84,auVar88,auVar71);
    auVar85 = vfmadd231ps_avx512vl(auVar85,auVar88,auVar72);
    auVar71 = vmulps_avx512vl(auVar75,auVar91);
    auVar89 = ZEXT1632(auVar41);
    auVar72 = vmulps_avx512vl(auVar76,auVar89);
    auVar73 = vfmadd231ps_avx512vl(auVar71,auVar88,auVar73);
    auVar74 = vfmadd231ps_avx512vl(auVar72,auVar88,auVar74);
    fVar204 = auVar41._0_4_;
    fVar205 = auVar41._4_4_;
    auVar71._4_4_ = fVar205 * auVar84._4_4_;
    auVar71._0_4_ = fVar204 * auVar84._0_4_;
    fVar207 = auVar41._8_4_;
    auVar71._8_4_ = fVar207 * auVar84._8_4_;
    fVar218 = auVar41._12_4_;
    auVar71._12_4_ = fVar218 * auVar84._12_4_;
    auVar71._16_4_ = auVar84._16_4_ * 0.0;
    auVar71._20_4_ = auVar84._20_4_ * 0.0;
    auVar71._24_4_ = auVar84._24_4_ * 0.0;
    auVar71._28_4_ = fVar195;
    auVar72._4_4_ = fVar205 * auVar85._4_4_;
    auVar72._0_4_ = fVar204 * auVar85._0_4_;
    auVar72._8_4_ = fVar207 * auVar85._8_4_;
    auVar72._12_4_ = fVar218 * auVar85._12_4_;
    auVar72._16_4_ = auVar85._16_4_ * 0.0;
    auVar72._20_4_ = auVar85._20_4_ * 0.0;
    auVar72._24_4_ = auVar85._24_4_ * 0.0;
    auVar72._28_4_ = auVar86._28_4_;
    auVar45 = vfmadd231ps_fma(auVar71,auVar88,ZEXT1632(auVar45));
    auVar50 = vfmadd231ps_fma(auVar72,auVar88,ZEXT1632(auVar50));
    auVar76._0_4_ = fVar204 * auVar73._0_4_;
    auVar76._4_4_ = fVar205 * auVar73._4_4_;
    auVar76._8_4_ = fVar207 * auVar73._8_4_;
    auVar76._12_4_ = fVar218 * auVar73._12_4_;
    auVar76._16_4_ = auVar73._16_4_ * 0.0;
    auVar76._20_4_ = auVar73._20_4_ * 0.0;
    auVar76._24_4_ = auVar73._24_4_ * 0.0;
    auVar76._28_4_ = 0;
    auVar86._4_4_ = fVar205 * auVar74._4_4_;
    auVar86._0_4_ = fVar204 * auVar74._0_4_;
    auVar86._8_4_ = fVar207 * auVar74._8_4_;
    auVar86._12_4_ = fVar218 * auVar74._12_4_;
    auVar86._16_4_ = auVar74._16_4_ * 0.0;
    auVar86._20_4_ = auVar74._20_4_ * 0.0;
    auVar86._24_4_ = auVar74._24_4_ * 0.0;
    auVar86._28_4_ = auVar73._28_4_;
    auVar54 = vfmadd231ps_fma(auVar76,auVar88,auVar84);
    auVar55 = vfmadd231ps_fma(auVar86,auVar88,auVar85);
    auVar73._28_4_ = auVar85._28_4_;
    auVar73._0_28_ =
         ZEXT1628(CONCAT412(fVar218 * auVar55._12_4_,
                            CONCAT48(fVar207 * auVar55._8_4_,
                                     CONCAT44(fVar205 * auVar55._4_4_,fVar204 * auVar55._0_4_))));
    auVar56 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar218 * auVar54._12_4_,
                                                 CONCAT48(fVar207 * auVar54._8_4_,
                                                          CONCAT44(fVar205 * auVar54._4_4_,
                                                                   fVar204 * auVar54._0_4_)))),
                              auVar88,ZEXT1632(auVar45));
    auVar64 = vfmadd231ps_fma(auVar73,auVar88,ZEXT1632(auVar50));
    auVar86 = vsubps_avx(ZEXT1632(auVar54),ZEXT1632(auVar45));
    auVar71 = vsubps_avx(ZEXT1632(auVar55),ZEXT1632(auVar50));
    auVar72 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar86 = vmulps_avx512vl(auVar86,auVar72);
    auVar71 = vmulps_avx512vl(auVar71,auVar72);
    auVar84._0_4_ = fVar206 * auVar86._0_4_;
    auVar84._4_4_ = fVar206 * auVar86._4_4_;
    auVar84._8_4_ = fVar206 * auVar86._8_4_;
    auVar84._12_4_ = fVar206 * auVar86._12_4_;
    auVar84._16_4_ = fVar206 * auVar86._16_4_;
    auVar84._20_4_ = fVar206 * auVar86._20_4_;
    auVar84._24_4_ = fVar206 * auVar86._24_4_;
    auVar84._28_4_ = 0;
    auVar86 = vmulps_avx512vl(auVar90,auVar71);
    auVar50 = vxorps_avx512vl(auVar75._0_16_,auVar75._0_16_);
    auVar71 = vpermt2ps_avx512vl(ZEXT1632(auVar56),_DAT_01fb9fc0,ZEXT1632(auVar50));
    auVar73 = vpermt2ps_avx512vl(ZEXT1632(auVar64),_DAT_01fb9fc0,ZEXT1632(auVar50));
    auVar125._0_4_ = auVar84._0_4_ + auVar56._0_4_;
    auVar125._4_4_ = auVar84._4_4_ + auVar56._4_4_;
    auVar125._8_4_ = auVar84._8_4_ + auVar56._8_4_;
    auVar125._12_4_ = auVar84._12_4_ + auVar56._12_4_;
    auVar125._16_4_ = auVar84._16_4_ + 0.0;
    auVar125._20_4_ = auVar84._20_4_ + 0.0;
    auVar125._24_4_ = auVar84._24_4_ + 0.0;
    auVar125._28_4_ = 0;
    auVar85 = ZEXT1632(auVar50);
    auVar74 = vpermt2ps_avx512vl(auVar84,_DAT_01fb9fc0,auVar85);
    auVar75 = vaddps_avx512vl(ZEXT1632(auVar64),auVar86);
    auVar76 = vpermt2ps_avx512vl(auVar86,_DAT_01fb9fc0,auVar85);
    auVar86 = vsubps_avx(auVar71,auVar74);
    auVar76 = vsubps_avx512vl(auVar73,auVar76);
    auVar74 = vmulps_avx512vl(auVar80,auVar89);
    auVar84 = vmulps_avx512vl(auVar81,auVar89);
    auVar74 = vfmadd231ps_avx512vl(auVar74,auVar88,auVar77);
    auVar77 = vfmadd231ps_avx512vl(auVar84,auVar88,auVar79);
    auVar79 = vmulps_avx512vl(auVar87,auVar89);
    auVar84 = vmulps_avx512vl(auVar82,auVar89);
    auVar79 = vfmadd231ps_avx512vl(auVar79,auVar88,auVar80);
    auVar80 = vfmadd231ps_avx512vl(auVar84,auVar88,auVar81);
    auVar81 = vmulps_avx512vl(auVar83,auVar89);
    auVar78 = vmulps_avx512vl(auVar78,auVar89);
    auVar45 = vfmadd231ps_fma(auVar81,auVar88,auVar87);
    auVar87 = vfmadd231ps_avx512vl(auVar78,auVar88,auVar82);
    auVar78 = vmulps_avx512vl(auVar89,auVar79);
    auVar83 = ZEXT1632(auVar41);
    auVar81 = vmulps_avx512vl(auVar83,auVar80);
    auVar74 = vfmadd231ps_avx512vl(auVar78,auVar88,auVar74);
    auVar77 = vfmadd231ps_avx512vl(auVar81,auVar88,auVar77);
    auVar87 = vmulps_avx512vl(auVar83,auVar87);
    auVar78 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar218 * auVar45._12_4_,
                                            CONCAT48(fVar207 * auVar45._8_4_,
                                                     CONCAT44(fVar205 * auVar45._4_4_,
                                                              fVar204 * auVar45._0_4_)))),auVar88,
                         auVar79);
    auVar79 = vfmadd231ps_avx512vl(auVar87,auVar88,auVar80);
    auVar87._4_4_ = fVar205 * auVar78._4_4_;
    auVar87._0_4_ = fVar204 * auVar78._0_4_;
    auVar87._8_4_ = fVar207 * auVar78._8_4_;
    auVar87._12_4_ = fVar218 * auVar78._12_4_;
    auVar87._16_4_ = auVar78._16_4_ * 0.0;
    auVar87._20_4_ = auVar78._20_4_ * 0.0;
    auVar87._24_4_ = auVar78._24_4_ * 0.0;
    auVar87._28_4_ = auVar82._28_4_;
    auVar80 = vmulps_avx512vl(auVar83,auVar79);
    auVar87 = vfmadd231ps_avx512vl(auVar87,auVar88,auVar74);
    auVar80 = vfmadd231ps_avx512vl(auVar80,auVar77,auVar88);
    auVar88 = vsubps_avx512vl(auVar78,auVar74);
    auVar74 = vsubps_avx512vl(auVar79,auVar77);
    auVar77 = vmulps_avx512vl(auVar88,auVar72);
    auVar72 = vmulps_avx512vl(auVar74,auVar72);
    fVar195 = fVar206 * auVar77._0_4_;
    fVar204 = fVar206 * auVar77._4_4_;
    auVar88._4_4_ = fVar204;
    auVar88._0_4_ = fVar195;
    fVar205 = fVar206 * auVar77._8_4_;
    auVar88._8_4_ = fVar205;
    fVar207 = fVar206 * auVar77._12_4_;
    auVar88._12_4_ = fVar207;
    fVar218 = fVar206 * auVar77._16_4_;
    auVar88._16_4_ = fVar218;
    fVar219 = fVar206 * auVar77._20_4_;
    auVar88._20_4_ = fVar219;
    fVar206 = fVar206 * auVar77._24_4_;
    auVar88._24_4_ = fVar206;
    auVar88._28_4_ = auVar77._28_4_;
    auVar72 = vmulps_avx512vl(auVar90,auVar72);
    auVar78 = vpermt2ps_avx512vl(auVar87,_DAT_01fb9fc0,auVar85);
    auVar79 = vpermt2ps_avx512vl(auVar80,_DAT_01fb9fc0,auVar85);
    auVar194._0_4_ = auVar87._0_4_ + fVar195;
    auVar194._4_4_ = auVar87._4_4_ + fVar204;
    auVar194._8_4_ = auVar87._8_4_ + fVar205;
    auVar194._12_4_ = auVar87._12_4_ + fVar207;
    auVar194._16_4_ = auVar87._16_4_ + fVar218;
    auVar194._20_4_ = auVar87._20_4_ + fVar219;
    auVar194._24_4_ = auVar87._24_4_ + fVar206;
    auVar194._28_4_ = auVar87._28_4_ + auVar77._28_4_;
    auVar88 = vpermt2ps_avx512vl(auVar88,_DAT_01fb9fc0,ZEXT1632(auVar50));
    auVar77 = vaddps_avx512vl(auVar80,auVar72);
    auVar72 = vpermt2ps_avx512vl(auVar72,_DAT_01fb9fc0,ZEXT1632(auVar50));
    auVar88 = vsubps_avx(auVar78,auVar88);
    auVar72 = vsubps_avx512vl(auVar79,auVar72);
    auVar92 = ZEXT1632(auVar56);
    auVar74 = vsubps_avx512vl(auVar87,auVar92);
    auVar94 = ZEXT1632(auVar64);
    auVar81 = vsubps_avx512vl(auVar80,auVar94);
    auVar82 = vsubps_avx512vl(auVar78,auVar71);
    auVar74 = vaddps_avx512vl(auVar74,auVar82);
    auVar82 = vsubps_avx512vl(auVar79,auVar73);
    auVar81 = vaddps_avx512vl(auVar81,auVar82);
    auVar82 = vmulps_avx512vl(auVar94,auVar74);
    auVar82 = vfnmadd231ps_avx512vl(auVar82,auVar92,auVar81);
    auVar83 = vmulps_avx512vl(auVar75,auVar74);
    auVar83 = vfnmadd231ps_avx512vl(auVar83,auVar125,auVar81);
    auVar84 = vmulps_avx512vl(auVar76,auVar74);
    auVar84 = vfnmadd231ps_avx512vl(auVar84,auVar86,auVar81);
    auVar85 = vmulps_avx512vl(auVar73,auVar74);
    auVar85 = vfnmadd231ps_avx512vl(auVar85,auVar71,auVar81);
    auVar89 = vmulps_avx512vl(auVar80,auVar74);
    auVar89 = vfnmadd231ps_avx512vl(auVar89,auVar87,auVar81);
    auVar90 = vmulps_avx512vl(auVar77,auVar74);
    auVar90 = vfnmadd231ps_avx512vl(auVar90,auVar194,auVar81);
    auVar91 = vmulps_avx512vl(auVar72,auVar74);
    auVar91 = vfnmadd231ps_avx512vl(auVar91,auVar88,auVar81);
    auVar74 = vmulps_avx512vl(auVar79,auVar74);
    auVar74 = vfnmadd231ps_avx512vl(auVar74,auVar78,auVar81);
    auVar81 = vminps_avx512vl(auVar82,auVar83);
    auVar82 = vmaxps_avx512vl(auVar82,auVar83);
    auVar83 = vminps_avx512vl(auVar84,auVar85);
    auVar81 = vminps_avx512vl(auVar81,auVar83);
    auVar83 = vmaxps_avx512vl(auVar84,auVar85);
    auVar82 = vmaxps_avx512vl(auVar82,auVar83);
    auVar83 = vminps_avx512vl(auVar89,auVar90);
    auVar84 = vmaxps_avx512vl(auVar89,auVar90);
    auVar85 = vminps_avx512vl(auVar91,auVar74);
    auVar83 = vminps_avx512vl(auVar83,auVar85);
    auVar81 = vminps_avx512vl(auVar81,auVar83);
    auVar74 = vmaxps_avx512vl(auVar91,auVar74);
    auVar74 = vmaxps_avx512vl(auVar84,auVar74);
    auVar82 = vmaxps_avx512vl(auVar82,auVar74);
    uVar14 = vcmpps_avx512vl(auVar81,local_260,2);
    auVar74._4_4_ = uStack_1bc;
    auVar74._0_4_ = local_1c0;
    auVar74._8_4_ = uStack_1b8;
    auVar74._12_4_ = uStack_1b4;
    auVar74._16_4_ = uStack_1b0;
    auVar74._20_4_ = uStack_1ac;
    auVar74._24_4_ = uStack_1a8;
    auVar74._28_4_ = uStack_1a4;
    uVar15 = vcmpps_avx512vl(auVar82,auVar74,5);
    bVar27 = (byte)uVar14 & (byte)uVar15 & 0x7f;
    if (bVar27 != 0) {
      auVar81 = vsubps_avx512vl(auVar71,auVar92);
      auVar82 = vsubps_avx512vl(auVar73,auVar94);
      auVar83 = vsubps_avx512vl(auVar78,auVar87);
      auVar81 = vaddps_avx512vl(auVar81,auVar83);
      auVar83 = vsubps_avx512vl(auVar79,auVar80);
      auVar82 = vaddps_avx512vl(auVar82,auVar83);
      auVar83 = vmulps_avx512vl(auVar94,auVar81);
      auVar83 = vfnmadd231ps_avx512vl(auVar83,auVar82,auVar92);
      auVar75 = vmulps_avx512vl(auVar75,auVar81);
      auVar75 = vfnmadd213ps_avx512vl(auVar125,auVar82,auVar75);
      auVar76 = vmulps_avx512vl(auVar76,auVar81);
      auVar76 = vfnmadd213ps_avx512vl(auVar86,auVar82,auVar76);
      auVar86 = vmulps_avx512vl(auVar73,auVar81);
      auVar73 = vfnmadd231ps_avx512vl(auVar86,auVar82,auVar71);
      auVar86 = vmulps_avx512vl(auVar80,auVar81);
      auVar80 = vfnmadd231ps_avx512vl(auVar86,auVar82,auVar87);
      auVar86 = vmulps_avx512vl(auVar77,auVar81);
      auVar77 = vfnmadd213ps_avx512vl(auVar194,auVar82,auVar86);
      auVar86 = vmulps_avx512vl(auVar72,auVar81);
      auVar84 = vfnmadd213ps_avx512vl(auVar88,auVar82,auVar86);
      auVar88 = vmulps_avx512vl(auVar79,auVar81);
      auVar78 = vfnmadd231ps_avx512vl(auVar88,auVar78,auVar82);
      auVar86 = vminps_avx(auVar83,auVar75);
      auVar88 = vmaxps_avx(auVar83,auVar75);
      auVar71 = vminps_avx(auVar76,auVar73);
      auVar71 = vminps_avx(auVar86,auVar71);
      auVar86 = vmaxps_avx(auVar76,auVar73);
      auVar88 = vmaxps_avx(auVar88,auVar86);
      auVar87 = vminps_avx(auVar80,auVar77);
      auVar86 = vmaxps_avx(auVar80,auVar77);
      auVar72 = vminps_avx(auVar84,auVar78);
      auVar87 = vminps_avx(auVar87,auVar72);
      auVar87 = vminps_avx(auVar71,auVar87);
      auVar71 = vmaxps_avx(auVar84,auVar78);
      auVar86 = vmaxps_avx(auVar86,auVar71);
      auVar88 = vmaxps_avx(auVar88,auVar86);
      uVar14 = vcmpps_avx512vl(auVar88,auVar74,5);
      uVar15 = vcmpps_avx512vl(auVar87,local_260,2);
      bVar27 = bVar27 & (byte)uVar14 & (byte)uVar15;
      if (bVar27 != 0) {
        auStack_430[uVar29] = (uint)bVar27;
        uVar14 = vmovlps_avx(auVar43);
        (&uStack_240)[uVar29] = uVar14;
        uVar1 = vmovlps_avx(auVar66);
        auStack_1a0[uVar29] = uVar1;
        uVar29 = (ulong)((int)uVar29 + 1);
      }
    }
    auVar43 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar237 = ZEXT1664(auVar43);
    auVar43 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar238 = ZEXT1664(auVar43);
    auVar88 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar239 = ZEXT3264(auVar88);
    auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
    auVar240 = ZEXT1664(auVar43);
    auVar241 = ZEXT3264(_DAT_01fb9fe0);
LAB_017e034e:
    do {
      do {
        do {
          auVar45 = auVar243._0_16_;
          auVar41 = auVar237._0_16_;
          if ((int)uVar29 == 0) {
            uVar109 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar19._4_4_ = uVar109;
            auVar19._0_4_ = uVar109;
            auVar19._8_4_ = uVar109;
            auVar19._12_4_ = uVar109;
            uVar14 = vcmpps_avx512vl(local_3f0,auVar19,2);
            uVar34 = (ulong)((uint)uVar34 & local_468 & (uint)uVar14);
            goto LAB_017df73f;
          }
          uVar28 = (int)uVar29 - 1;
          uVar30 = (ulong)uVar28;
          uVar6 = auStack_430[uVar30];
          auVar66._8_8_ = 0;
          auVar66._0_8_ = auStack_1a0[uVar30];
          uVar1 = 0;
          for (uVar33 = (ulong)uVar6; (uVar33 & 1) == 0; uVar33 = uVar33 >> 1 | 0x8000000000000000)
          {
            uVar1 = uVar1 + 1;
          }
          uVar32 = uVar6 - 1 & uVar6;
          bVar37 = uVar32 == 0;
          auStack_430[uVar30] = uVar32;
          if (bVar37) {
            uVar29 = (ulong)uVar28;
          }
          auVar104._8_8_ = 0;
          auVar104._0_8_ = uVar1;
          auVar43 = vpunpcklqdq_avx(auVar104,ZEXT416((int)uVar1 + 1));
          auVar43 = vcvtqq2ps_avx512vl(auVar43);
          auVar43 = vmulps_avx512vl(auVar43,auVar240._0_16_);
          uVar109 = *(undefined4 *)((long)&uStack_240 + uVar30 * 8 + 4);
          auVar16._4_4_ = uVar109;
          auVar16._0_4_ = uVar109;
          auVar16._8_4_ = uVar109;
          auVar16._12_4_ = uVar109;
          auVar50 = vmulps_avx512vl(auVar43,auVar16);
          auVar43 = vsubps_avx512vl(auVar45,auVar43);
          uVar109 = *(undefined4 *)(&uStack_240 + uVar30);
          auVar17._4_4_ = uVar109;
          auVar17._0_4_ = uVar109;
          auVar17._8_4_ = uVar109;
          auVar17._12_4_ = uVar109;
          auVar43 = vfmadd231ps_avx512vl(auVar50,auVar43,auVar17);
          auVar50 = vmovshdup_avx(auVar43);
          fVar206 = auVar50._0_4_ - auVar43._0_4_;
          vucomiss_avx512f(ZEXT416((uint)fVar206));
          if (uVar6 == 0 || bVar37) goto LAB_017dfe45;
          auVar50 = vshufps_avx(auVar66,auVar66,0x50);
          vucomiss_avx512f(ZEXT416((uint)fVar206));
          auVar56 = vsubps_avx512vl(auVar45,auVar50);
          fVar195 = auVar50._0_4_;
          auVar142._0_4_ = fVar195 * fVar133;
          fVar204 = auVar50._4_4_;
          auVar142._4_4_ = fVar204 * fVar138;
          fVar205 = auVar50._8_4_;
          auVar142._8_4_ = fVar205 * fVar133;
          fVar207 = auVar50._12_4_;
          auVar142._12_4_ = fVar207 * fVar138;
          auVar155._0_4_ = fVar195 * fVar139;
          auVar155._4_4_ = fVar204 * fVar148;
          auVar155._8_4_ = fVar205 * fVar139;
          auVar155._12_4_ = fVar207 * fVar148;
          auVar162._0_4_ = fVar195 * fVar108;
          auVar162._4_4_ = fVar204 * fVar114;
          auVar162._8_4_ = fVar205 * fVar108;
          auVar162._12_4_ = fVar207 * fVar114;
          auVar128._0_4_ = fVar195 * fVar115;
          auVar128._4_4_ = fVar204 * fVar116;
          auVar128._8_4_ = fVar205 * fVar115;
          auVar128._12_4_ = fVar207 * fVar116;
          auVar50 = vfmadd231ps_fma(auVar142,auVar56,auVar51);
          auVar54 = vfmadd231ps_fma(auVar155,auVar56,auVar52);
          auVar55 = vfmadd231ps_fma(auVar162,auVar56,auVar53);
          auVar56 = vfmadd231ps_fma(auVar128,auVar56,auVar112);
          auVar79._16_16_ = auVar50;
          auVar79._0_16_ = auVar50;
          auVar80._16_16_ = auVar54;
          auVar80._0_16_ = auVar54;
          auVar82._16_16_ = auVar55;
          auVar82._0_16_ = auVar55;
          auVar86 = vpermps_avx512vl(auVar241._0_32_,ZEXT1632(auVar43));
          auVar88 = vsubps_avx(auVar80,auVar79);
          auVar54 = vfmadd213ps_fma(auVar88,auVar86,auVar79);
          auVar88 = vsubps_avx(auVar82,auVar80);
          auVar64 = vfmadd213ps_fma(auVar88,auVar86,auVar80);
          auVar50 = vsubps_avx(auVar56,auVar55);
          auVar81._16_16_ = auVar50;
          auVar81._0_16_ = auVar50;
          auVar50 = vfmadd213ps_fma(auVar81,auVar86,auVar82);
          auVar88 = vsubps_avx(ZEXT1632(auVar64),ZEXT1632(auVar54));
          auVar54 = vfmadd213ps_fma(auVar88,auVar86,ZEXT1632(auVar54));
          auVar88 = vsubps_avx(ZEXT1632(auVar50),ZEXT1632(auVar64));
          auVar50 = vfmadd213ps_fma(auVar88,auVar86,ZEXT1632(auVar64));
          auVar88 = vsubps_avx(ZEXT1632(auVar50),ZEXT1632(auVar54));
          auVar70 = vfmadd231ps_fma(ZEXT1632(auVar54),auVar88,auVar86);
          auVar88 = vmulps_avx512vl(auVar88,auVar239._0_32_);
          auVar78._16_16_ = auVar88._16_16_;
          auVar50 = vmulss_avx512f(ZEXT416((uint)fVar206),SUB6416(ZEXT464(0x3eaaaaab),0));
          fVar195 = auVar50._0_4_;
          auVar163._0_8_ =
               CONCAT44(auVar70._4_4_ + fVar195 * auVar88._4_4_,
                        auVar70._0_4_ + fVar195 * auVar88._0_4_);
          auVar163._8_4_ = auVar70._8_4_ + fVar195 * auVar88._8_4_;
          auVar163._12_4_ = auVar70._12_4_ + fVar195 * auVar88._12_4_;
          auVar143._0_4_ = fVar195 * auVar88._16_4_;
          auVar143._4_4_ = fVar195 * auVar88._20_4_;
          auVar143._8_4_ = fVar195 * auVar88._24_4_;
          auVar143._12_4_ = fVar195 * auVar88._28_4_;
          auVar63 = vsubps_avx((undefined1  [16])0x0,auVar143);
          auVar64 = vshufpd_avx(auVar70,auVar70,3);
          auVar67 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
          auVar50 = vsubps_avx(auVar64,auVar70);
          auVar54 = vsubps_avx(auVar67,(undefined1  [16])0x0);
          auVar181._0_4_ = auVar50._0_4_ + auVar54._0_4_;
          auVar181._4_4_ = auVar50._4_4_ + auVar54._4_4_;
          auVar181._8_4_ = auVar50._8_4_ + auVar54._8_4_;
          auVar181._12_4_ = auVar50._12_4_ + auVar54._12_4_;
          auVar50 = vshufps_avx(auVar70,auVar70,0xb1);
          auVar54 = vshufps_avx(auVar163,auVar163,0xb1);
          auVar55 = vshufps_avx(auVar63,auVar63,0xb1);
          auVar56 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
          auVar230._4_4_ = auVar181._0_4_;
          auVar230._0_4_ = auVar181._0_4_;
          auVar230._8_4_ = auVar181._0_4_;
          auVar230._12_4_ = auVar181._0_4_;
          auVar59 = vshufps_avx(auVar181,auVar181,0x55);
          fVar195 = auVar59._0_4_;
          auVar192._0_4_ = auVar50._0_4_ * fVar195;
          fVar204 = auVar59._4_4_;
          auVar192._4_4_ = auVar50._4_4_ * fVar204;
          fVar205 = auVar59._8_4_;
          auVar192._8_4_ = auVar50._8_4_ * fVar205;
          fVar207 = auVar59._12_4_;
          auVar192._12_4_ = auVar50._12_4_ * fVar207;
          auVar197._0_4_ = auVar54._0_4_ * fVar195;
          auVar197._4_4_ = auVar54._4_4_ * fVar204;
          auVar197._8_4_ = auVar54._8_4_ * fVar205;
          auVar197._12_4_ = auVar54._12_4_ * fVar207;
          auVar210._0_4_ = auVar55._0_4_ * fVar195;
          auVar210._4_4_ = auVar55._4_4_ * fVar204;
          auVar210._8_4_ = auVar55._8_4_ * fVar205;
          auVar210._12_4_ = auVar55._12_4_ * fVar207;
          auVar182._0_4_ = auVar56._0_4_ * fVar195;
          auVar182._4_4_ = auVar56._4_4_ * fVar204;
          auVar182._8_4_ = auVar56._8_4_ * fVar205;
          auVar182._12_4_ = auVar56._12_4_ * fVar207;
          auVar50 = vfmadd231ps_fma(auVar192,auVar230,auVar70);
          auVar54 = vfmadd231ps_fma(auVar197,auVar230,auVar163);
          auVar61 = vfmadd231ps_fma(auVar210,auVar230,auVar63);
          auVar62 = vfmadd231ps_fma(auVar182,(undefined1  [16])0x0,auVar230);
          auVar59 = vshufpd_avx(auVar50,auVar50,1);
          auVar60 = vshufpd_avx(auVar54,auVar54,1);
          auVar57 = vshufpd_avx512vl(auVar61,auVar61,1);
          auVar58 = vshufpd_avx512vl(auVar62,auVar62,1);
          auVar55 = vminss_avx(auVar50,auVar54);
          auVar50 = vmaxss_avx(auVar54,auVar50);
          auVar56 = vminss_avx(auVar61,auVar62);
          auVar54 = vmaxss_avx(auVar62,auVar61);
          auVar55 = vminss_avx(auVar55,auVar56);
          auVar50 = vmaxss_avx(auVar54,auVar50);
          auVar56 = vminss_avx(auVar59,auVar60);
          auVar54 = vmaxss_avx(auVar60,auVar59);
          auVar59 = vminss_avx512f(auVar57,auVar58);
          auVar60 = vmaxss_avx512f(auVar58,auVar57);
          auVar54 = vmaxss_avx(auVar60,auVar54);
          auVar56 = vminss_avx512f(auVar56,auVar59);
          vucomiss_avx512f(auVar55);
          fVar204 = auVar54._0_4_;
          fVar195 = auVar50._0_4_;
          if (4 < (uint)uVar29) {
            bVar38 = fVar204 == -0.0001;
            bVar35 = NAN(fVar204);
            if (fVar204 <= -0.0001) goto LAB_017e0577;
            break;
          }
LAB_017e0577:
          auVar59 = vucomiss_avx512f(auVar56);
          bVar38 = fVar204 <= -0.0001;
          bVar36 = -0.0001 < fVar195;
          bVar35 = bVar38;
          if (!bVar38) break;
          uVar14 = vcmpps_avx512vl(auVar55,auVar59,5);
          uVar15 = vcmpps_avx512vl(auVar56,auVar59,5);
          uVar28 = (uint)uVar14 & (uint)uVar15;
          bVar11 = (uVar28 & 1) == 0;
          bVar38 = bVar36 && bVar11;
          bVar35 = bVar36 && (uVar28 & 1) == 0;
        } while (!bVar36 || !bVar11);
        auVar61 = auVar244._0_16_;
        vcmpss_avx512f(auVar55,auVar61,1);
        uVar14 = vcmpss_avx512f(auVar50,auVar61,1);
        bVar36 = (bool)((byte)uVar14 & 1);
        auVar78._0_16_ = auVar245._0_16_;
        auVar92._4_28_ = auVar78._4_28_;
        auVar92._0_4_ = (float)((uint)bVar36 * -0x40800000 + (uint)!bVar36 * auVar245._0_4_);
        vucomiss_avx512f(auVar92._0_16_);
        bVar35 = (bool)(!bVar38 | bVar35);
        bVar36 = bVar35 == false;
        auVar94._16_16_ = auVar78._16_16_;
        auVar94._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
        auVar93._4_28_ = auVar94._4_28_;
        auVar93._0_4_ = (uint)bVar35 * auVar244._0_4_ + (uint)!bVar35 * 0x7f800000;
        auVar60 = auVar93._0_16_;
        auVar96._16_16_ = auVar78._16_16_;
        auVar96._0_16_ = SUB6416(ZEXT464(0xff800000),0);
        auVar95._4_28_ = auVar96._4_28_;
        auVar95._0_4_ = (uint)bVar35 * auVar244._0_4_ + (uint)!bVar35 * -0x800000;
        auVar59 = auVar95._0_16_;
        uVar14 = vcmpss_avx512f(auVar56,auVar61,1);
        bVar38 = (bool)((byte)uVar14 & 1);
        auVar98._16_16_ = auVar78._16_16_;
        auVar98._0_16_ = auVar245._0_16_;
        auVar97._4_28_ = auVar98._4_28_;
        auVar97._0_4_ = (float)((uint)bVar38 * -0x40800000 + (uint)!bVar38 * auVar245._0_4_);
        vucomiss_avx512f(auVar97._0_16_);
        if ((bVar35) || (bVar36)) {
          auVar56 = vucomiss_avx512f(auVar55);
          if ((bVar35) || (bVar36)) {
            auVar62 = vxorps_avx512vl(auVar55,auVar238._0_16_);
            auVar55 = vsubss_avx512f(auVar56,auVar55);
            auVar55 = vdivss_avx512f(auVar62,auVar55);
            auVar56 = vsubss_avx512f(ZEXT416(0x3f800000),auVar55);
            auVar56 = vfmadd213ss_avx512f(auVar56,auVar61,auVar55);
            auVar55 = auVar56;
          }
          else {
            auVar55 = vxorps_avx512vl(auVar56,auVar56);
            vucomiss_avx512f(auVar55);
            auVar56 = ZEXT416(0x3f800000);
            if ((bVar35) || (bVar36)) {
              auVar56 = SUB6416(ZEXT464(0xff800000),0);
              auVar55 = SUB6416(ZEXT464(0x7f800000),0);
            }
          }
          auVar60 = vminss_avx512f(auVar60,auVar55);
          auVar59 = vmaxss_avx(auVar56,auVar59);
        }
        auVar245 = ZEXT464(0x3f800000);
        uVar14 = vcmpss_avx512f(auVar54,auVar61,1);
        bVar38 = (bool)((byte)uVar14 & 1);
        auVar54 = auVar245._0_16_;
        fVar205 = (float)((uint)bVar38 * -0x40800000 + (uint)!bVar38 * 0x3f800000);
        if ((auVar92._0_4_ != fVar205) || (NAN(auVar92._0_4_) || NAN(fVar205))) {
          if ((fVar204 != fVar195) || (NAN(fVar204) || NAN(fVar195))) {
            auVar50 = vxorps_avx512vl(auVar50,auVar238._0_16_);
            auVar183._0_4_ = auVar50._0_4_ / (fVar204 - fVar195);
            auVar183._4_12_ = auVar50._4_12_;
            auVar50 = vsubss_avx512f(auVar54,auVar183);
            auVar50 = vfmadd213ss_avx512f(auVar50,auVar61,auVar183);
            auVar55 = auVar50;
          }
          else if ((fVar195 != 0.0) ||
                  (auVar50 = auVar54, auVar55 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar195))) {
            auVar50 = SUB6416(ZEXT464(0xff800000),0);
            auVar55 = SUB6416(ZEXT464(0x7f800000),0);
          }
          auVar60 = vminss_avx(auVar60,auVar55);
          auVar59 = vmaxss_avx(auVar50,auVar59);
        }
        bVar38 = auVar97._0_4_ != fVar205;
        auVar50 = vminss_avx512f(auVar60,auVar54);
        auVar100._16_16_ = auVar78._16_16_;
        auVar100._0_16_ = auVar60;
        auVar99._4_28_ = auVar100._4_28_;
        auVar99._0_4_ = (uint)bVar38 * auVar50._0_4_ + (uint)!bVar38 * auVar60._0_4_;
        auVar50 = vmaxss_avx512f(auVar54,auVar59);
        auVar102._16_16_ = auVar78._16_16_;
        auVar102._0_16_ = auVar59;
        auVar101._4_28_ = auVar102._4_28_;
        auVar101._0_4_ = (uint)bVar38 * auVar50._0_4_ + (uint)!bVar38 * auVar59._0_4_;
        auVar50 = vmaxss_avx512f(auVar61,auVar99._0_16_);
        auVar55 = vminss_avx512f(auVar101._0_16_,auVar54);
      } while (auVar55._0_4_ < auVar50._0_4_);
      auVar61 = vmaxss_avx512f(auVar61,ZEXT416((uint)(auVar50._0_4_ + -0.1)));
      auVar62 = vminss_avx512f(ZEXT416((uint)(auVar55._0_4_ + 0.1)),auVar54);
      auVar129._0_8_ = auVar70._0_8_;
      auVar129._8_8_ = auVar129._0_8_;
      auVar198._8_8_ = auVar163._0_8_;
      auVar198._0_8_ = auVar163._0_8_;
      auVar211._8_8_ = auVar63._0_8_;
      auVar211._0_8_ = auVar63._0_8_;
      auVar50 = vshufpd_avx(auVar163,auVar163,3);
      auVar55 = vshufpd_avx(auVar63,auVar63,3);
      auVar56 = vshufps_avx(auVar61,auVar62,0);
      auVar63 = vsubps_avx512vl(auVar45,auVar56);
      fVar195 = auVar56._0_4_;
      auVar156._0_4_ = fVar195 * auVar64._0_4_;
      fVar204 = auVar56._4_4_;
      auVar156._4_4_ = fVar204 * auVar64._4_4_;
      fVar205 = auVar56._8_4_;
      auVar156._8_4_ = fVar205 * auVar64._8_4_;
      fVar207 = auVar56._12_4_;
      auVar156._12_4_ = fVar207 * auVar64._12_4_;
      auVar164._0_4_ = fVar195 * auVar50._0_4_;
      auVar164._4_4_ = fVar204 * auVar50._4_4_;
      auVar164._8_4_ = fVar205 * auVar50._8_4_;
      auVar164._12_4_ = fVar207 * auVar50._12_4_;
      auVar232._0_4_ = auVar55._0_4_ * fVar195;
      auVar232._4_4_ = auVar55._4_4_ * fVar204;
      auVar232._8_4_ = auVar55._8_4_ * fVar205;
      auVar232._12_4_ = auVar55._12_4_ * fVar207;
      auVar144._0_4_ = fVar195 * auVar67._0_4_;
      auVar144._4_4_ = fVar204 * auVar67._4_4_;
      auVar144._8_4_ = fVar205 * auVar67._8_4_;
      auVar144._12_4_ = fVar207 * auVar67._12_4_;
      auVar67 = vfmadd231ps_fma(auVar156,auVar63,auVar129);
      auVar59 = vfmadd231ps_fma(auVar164,auVar63,auVar198);
      auVar60 = vfmadd231ps_fma(auVar232,auVar63,auVar211);
      auVar63 = vfmadd231ps_fma(auVar144,auVar63,ZEXT816(0));
      auVar55 = vsubss_avx512f(auVar54,auVar61);
      auVar50 = vmovshdup_avx(auVar66);
      auVar57 = vfmadd231ss_fma(ZEXT416((uint)(auVar50._0_4_ * auVar61._0_4_)),auVar66,auVar55);
      auVar55 = vsubss_avx512f(auVar54,auVar62);
      auVar58 = vfmadd231ss_fma(ZEXT416((uint)(auVar50._0_4_ * auVar62._0_4_)),auVar66,auVar55);
      auVar61 = vdivss_avx512f(auVar54,ZEXT416((uint)fVar206));
      auVar50 = vsubps_avx(auVar59,auVar67);
      auVar56 = vmulps_avx512vl(auVar50,auVar41);
      auVar50 = vsubps_avx(auVar60,auVar59);
      auVar64 = vmulps_avx512vl(auVar50,auVar41);
      auVar50 = vsubps_avx(auVar63,auVar60);
      auVar50 = vmulps_avx512vl(auVar50,auVar41);
      auVar55 = vminps_avx(auVar64,auVar50);
      auVar50 = vmaxps_avx(auVar64,auVar50);
      auVar55 = vminps_avx(auVar56,auVar55);
      auVar50 = vmaxps_avx(auVar56,auVar50);
      auVar56 = vshufpd_avx(auVar55,auVar55,3);
      auVar64 = vshufpd_avx(auVar50,auVar50,3);
      auVar55 = vminps_avx(auVar55,auVar56);
      auVar50 = vmaxps_avx(auVar50,auVar64);
      fVar206 = auVar61._0_4_;
      auVar184._0_4_ = auVar55._0_4_ * fVar206;
      auVar184._4_4_ = auVar55._4_4_ * fVar206;
      auVar184._8_4_ = auVar55._8_4_ * fVar206;
      auVar184._12_4_ = auVar55._12_4_ * fVar206;
      auVar171._0_4_ = fVar206 * auVar50._0_4_;
      auVar171._4_4_ = fVar206 * auVar50._4_4_;
      auVar171._8_4_ = fVar206 * auVar50._8_4_;
      auVar171._12_4_ = fVar206 * auVar50._12_4_;
      auVar61 = vdivss_avx512f(auVar54,ZEXT416((uint)(auVar58._0_4_ - auVar57._0_4_)));
      auVar50 = vshufpd_avx(auVar67,auVar67,3);
      auVar55 = vshufpd_avx(auVar59,auVar59,3);
      auVar56 = vshufpd_avx(auVar60,auVar60,3);
      auVar64 = vshufpd_avx(auVar63,auVar63,3);
      auVar50 = vsubps_avx(auVar50,auVar67);
      auVar67 = vsubps_avx(auVar55,auVar59);
      auVar59 = vsubps_avx(auVar56,auVar60);
      auVar64 = vsubps_avx(auVar64,auVar63);
      auVar55 = vminps_avx(auVar50,auVar67);
      auVar50 = vmaxps_avx(auVar50,auVar67);
      auVar56 = vminps_avx(auVar59,auVar64);
      auVar56 = vminps_avx(auVar55,auVar56);
      auVar55 = vmaxps_avx(auVar59,auVar64);
      auVar50 = vmaxps_avx(auVar50,auVar55);
      fVar206 = auVar61._0_4_;
      auVar212._0_4_ = fVar206 * auVar56._0_4_;
      auVar212._4_4_ = fVar206 * auVar56._4_4_;
      auVar212._8_4_ = fVar206 * auVar56._8_4_;
      auVar212._12_4_ = fVar206 * auVar56._12_4_;
      auVar199._0_4_ = fVar206 * auVar50._0_4_;
      auVar199._4_4_ = fVar206 * auVar50._4_4_;
      auVar199._8_4_ = fVar206 * auVar50._8_4_;
      auVar199._12_4_ = fVar206 * auVar50._12_4_;
      auVar64 = vinsertps_avx(auVar43,auVar57,0x10);
      auVar65 = vpermt2ps_avx512vl(auVar43,_DAT_01fb9f90,auVar58);
      auVar113._0_4_ = auVar64._0_4_ + auVar65._0_4_;
      auVar113._4_4_ = auVar64._4_4_ + auVar65._4_4_;
      auVar113._8_4_ = auVar64._8_4_ + auVar65._8_4_;
      auVar113._12_4_ = auVar64._12_4_ + auVar65._12_4_;
      auVar18._8_4_ = 0x3f000000;
      auVar18._0_8_ = 0x3f0000003f000000;
      auVar18._12_4_ = 0x3f000000;
      auVar61 = vmulps_avx512vl(auVar113,auVar18);
      auVar55 = vshufps_avx(auVar61,auVar61,0x54);
      uVar109 = auVar61._0_4_;
      auVar123._4_4_ = uVar109;
      auVar123._0_4_ = uVar109;
      auVar123._8_4_ = uVar109;
      auVar123._12_4_ = uVar109;
      auVar56 = vfmadd213ps_fma(auVar42,auVar123,auVar39);
      auVar67 = vfmadd213ps_fma(local_270,auVar123,auVar44);
      auVar59 = vfmadd213ps_fma(local_280,auVar123,auVar40);
      auVar50 = vsubps_avx(auVar67,auVar56);
      auVar56 = vfmadd213ps_fma(auVar50,auVar123,auVar56);
      auVar50 = vsubps_avx(auVar59,auVar67);
      auVar50 = vfmadd213ps_fma(auVar50,auVar123,auVar67);
      auVar50 = vsubps_avx(auVar50,auVar56);
      auVar56 = vfmadd231ps_fma(auVar56,auVar50,auVar123);
      auVar60 = vmulps_avx512vl(auVar50,auVar41);
      auVar223._8_8_ = auVar56._0_8_;
      auVar223._0_8_ = auVar56._0_8_;
      auVar50 = vshufpd_avx(auVar56,auVar56,3);
      auVar56 = vshufps_avx(auVar61,auVar61,0x55);
      auVar67 = vsubps_avx(auVar50,auVar223);
      auVar59 = vfmadd231ps_fma(auVar223,auVar56,auVar67);
      auVar233._8_8_ = auVar60._0_8_;
      auVar233._0_8_ = auVar60._0_8_;
      auVar50 = vshufpd_avx(auVar60,auVar60,3);
      auVar50 = vsubps_avx512vl(auVar50,auVar233);
      auVar50 = vfmadd213ps_avx512vl(auVar50,auVar56,auVar233);
      auVar124._0_8_ = auVar67._0_8_ ^ 0x8000000080000000;
      auVar124._8_4_ = auVar67._8_4_ ^ 0x80000000;
      auVar124._12_4_ = auVar67._12_4_ ^ 0x80000000;
      auVar56 = vmovshdup_avx512vl(auVar50);
      auVar234._0_8_ = auVar56._0_8_ ^ 0x8000000080000000;
      auVar234._8_4_ = auVar56._8_4_ ^ 0x80000000;
      auVar234._12_4_ = auVar56._12_4_ ^ 0x80000000;
      auVar60 = vmovshdup_avx512vl(auVar67);
      auVar63 = vpermt2ps_avx512vl(auVar234,ZEXT416(5),auVar67);
      auVar66 = vxorps_avx512vl(ZEXT416(5),ZEXT416(5));
      auVar244 = ZEXT1664(auVar66);
      auVar56 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar56._0_4_ * auVar67._0_4_)),auVar50,auVar60);
      auVar67 = vpermt2ps_avx512vl(auVar50,SUB6416(ZEXT464(4),0),auVar124);
      auVar145._0_4_ = auVar56._0_4_;
      auVar145._4_4_ = auVar145._0_4_;
      auVar145._8_4_ = auVar145._0_4_;
      auVar145._12_4_ = auVar145._0_4_;
      auVar50 = vdivps_avx(auVar63,auVar145);
      auVar68 = vdivps_avx512vl(auVar67,auVar145);
      fVar206 = auVar59._0_4_;
      auVar56 = vshufps_avx(auVar59,auVar59,0x55);
      auVar224._0_4_ = fVar206 * auVar50._0_4_ + auVar56._0_4_ * auVar68._0_4_;
      auVar224._4_4_ = fVar206 * auVar50._4_4_ + auVar56._4_4_ * auVar68._4_4_;
      auVar224._8_4_ = fVar206 * auVar50._8_4_ + auVar56._8_4_ * auVar68._8_4_;
      auVar224._12_4_ = fVar206 * auVar50._12_4_ + auVar56._12_4_ * auVar68._12_4_;
      auVar62 = vsubps_avx(auVar55,auVar224);
      auVar56 = vmovshdup_avx(auVar50);
      auVar55 = vinsertps_avx(auVar184,auVar212,0x1c);
      auVar235._0_4_ = auVar56._0_4_ * auVar55._0_4_;
      auVar235._4_4_ = auVar56._4_4_ * auVar55._4_4_;
      auVar235._8_4_ = auVar56._8_4_ * auVar55._8_4_;
      auVar235._12_4_ = auVar56._12_4_ * auVar55._12_4_;
      auVar70 = vinsertps_avx512f(auVar171,auVar199,0x1c);
      auVar56 = vmulps_avx512vl(auVar56,auVar70);
      auVar63 = vminps_avx512vl(auVar235,auVar56);
      auVar59 = vmaxps_avx(auVar56,auVar235);
      auVar60 = vmovshdup_avx(auVar68);
      auVar56 = vinsertps_avx(auVar212,auVar184,0x4c);
      auVar213._0_4_ = auVar60._0_4_ * auVar56._0_4_;
      auVar213._4_4_ = auVar60._4_4_ * auVar56._4_4_;
      auVar213._8_4_ = auVar60._8_4_ * auVar56._8_4_;
      auVar213._12_4_ = auVar60._12_4_ * auVar56._12_4_;
      auVar67 = vinsertps_avx(auVar199,auVar171,0x4c);
      auVar200._0_4_ = auVar60._0_4_ * auVar67._0_4_;
      auVar200._4_4_ = auVar60._4_4_ * auVar67._4_4_;
      auVar200._8_4_ = auVar60._8_4_ * auVar67._8_4_;
      auVar200._12_4_ = auVar60._12_4_ * auVar67._12_4_;
      auVar60 = vminps_avx(auVar213,auVar200);
      auVar63 = vaddps_avx512vl(auVar63,auVar60);
      auVar60 = vmaxps_avx(auVar200,auVar213);
      auVar201._0_4_ = auVar59._0_4_ + auVar60._0_4_;
      auVar201._4_4_ = auVar59._4_4_ + auVar60._4_4_;
      auVar201._8_4_ = auVar59._8_4_ + auVar60._8_4_;
      auVar201._12_4_ = auVar59._12_4_ + auVar60._12_4_;
      auVar214._8_8_ = 0x3f80000000000000;
      auVar214._0_8_ = 0x3f80000000000000;
      auVar59 = vsubps_avx(auVar214,auVar201);
      auVar60 = vsubps_avx(auVar214,auVar63);
      auVar63 = vsubps_avx(auVar64,auVar61);
      auVar61 = vsubps_avx(auVar65,auVar61);
      fVar207 = auVar63._0_4_;
      auVar236._0_4_ = fVar207 * auVar59._0_4_;
      fVar218 = auVar63._4_4_;
      auVar236._4_4_ = fVar218 * auVar59._4_4_;
      fVar219 = auVar63._8_4_;
      auVar236._8_4_ = fVar219 * auVar59._8_4_;
      fVar220 = auVar63._12_4_;
      auVar236._12_4_ = fVar220 * auVar59._12_4_;
      auVar69 = vbroadcastss_avx512vl(auVar50);
      auVar55 = vmulps_avx512vl(auVar69,auVar55);
      auVar70 = vmulps_avx512vl(auVar69,auVar70);
      auVar69 = vminps_avx512vl(auVar55,auVar70);
      auVar70 = vmaxps_avx512vl(auVar70,auVar55);
      auVar55 = vbroadcastss_avx512vl(auVar68);
      auVar56 = vmulps_avx512vl(auVar55,auVar56);
      auVar55 = vmulps_avx512vl(auVar55,auVar67);
      auVar67 = vminps_avx512vl(auVar56,auVar55);
      auVar67 = vaddps_avx512vl(auVar69,auVar67);
      auVar63 = vmulps_avx512vl(auVar63,auVar60);
      fVar206 = auVar61._0_4_;
      auVar202._0_4_ = fVar206 * auVar59._0_4_;
      fVar195 = auVar61._4_4_;
      auVar202._4_4_ = fVar195 * auVar59._4_4_;
      fVar204 = auVar61._8_4_;
      auVar202._8_4_ = fVar204 * auVar59._8_4_;
      fVar205 = auVar61._12_4_;
      auVar202._12_4_ = fVar205 * auVar59._12_4_;
      auVar215._0_4_ = fVar206 * auVar60._0_4_;
      auVar215._4_4_ = fVar195 * auVar60._4_4_;
      auVar215._8_4_ = fVar204 * auVar60._8_4_;
      auVar215._12_4_ = fVar205 * auVar60._12_4_;
      auVar55 = vmaxps_avx(auVar55,auVar56);
      auVar172._0_4_ = auVar70._0_4_ + auVar55._0_4_;
      auVar172._4_4_ = auVar70._4_4_ + auVar55._4_4_;
      auVar172._8_4_ = auVar70._8_4_ + auVar55._8_4_;
      auVar172._12_4_ = auVar70._12_4_ + auVar55._12_4_;
      auVar185._8_8_ = 0x3f800000;
      auVar185._0_8_ = 0x3f800000;
      auVar55 = vsubps_avx(auVar185,auVar172);
      auVar56 = vsubps_avx512vl(auVar185,auVar67);
      auVar231._0_4_ = fVar207 * auVar55._0_4_;
      auVar231._4_4_ = fVar218 * auVar55._4_4_;
      auVar231._8_4_ = fVar219 * auVar55._8_4_;
      auVar231._12_4_ = fVar220 * auVar55._12_4_;
      auVar225._0_4_ = fVar207 * auVar56._0_4_;
      auVar225._4_4_ = fVar218 * auVar56._4_4_;
      auVar225._8_4_ = fVar219 * auVar56._8_4_;
      auVar225._12_4_ = fVar220 * auVar56._12_4_;
      auVar173._0_4_ = fVar206 * auVar55._0_4_;
      auVar173._4_4_ = fVar195 * auVar55._4_4_;
      auVar173._8_4_ = fVar204 * auVar55._8_4_;
      auVar173._12_4_ = fVar205 * auVar55._12_4_;
      auVar186._0_4_ = fVar206 * auVar56._0_4_;
      auVar186._4_4_ = fVar195 * auVar56._4_4_;
      auVar186._8_4_ = fVar204 * auVar56._8_4_;
      auVar186._12_4_ = fVar205 * auVar56._12_4_;
      auVar55 = vminps_avx(auVar231,auVar225);
      auVar56 = vminps_avx512vl(auVar173,auVar186);
      auVar67 = vminps_avx512vl(auVar55,auVar56);
      auVar55 = vmaxps_avx(auVar225,auVar231);
      auVar56 = vmaxps_avx(auVar186,auVar173);
      auVar56 = vmaxps_avx(auVar56,auVar55);
      auVar59 = vminps_avx512vl(auVar236,auVar63);
      auVar55 = vminps_avx(auVar202,auVar215);
      auVar55 = vminps_avx(auVar59,auVar55);
      auVar55 = vhaddps_avx(auVar67,auVar55);
      auVar59 = vmaxps_avx512vl(auVar63,auVar236);
      auVar67 = vmaxps_avx(auVar215,auVar202);
      auVar67 = vmaxps_avx(auVar67,auVar59);
      auVar56 = vhaddps_avx(auVar56,auVar67);
      auVar55 = vshufps_avx(auVar55,auVar55,0xe8);
      auVar56 = vshufps_avx(auVar56,auVar56,0xe8);
      auVar174._0_4_ = auVar55._0_4_ + auVar62._0_4_;
      auVar174._4_4_ = auVar55._4_4_ + auVar62._4_4_;
      auVar174._8_4_ = auVar55._8_4_ + auVar62._8_4_;
      auVar174._12_4_ = auVar55._12_4_ + auVar62._12_4_;
      auVar187._0_4_ = auVar56._0_4_ + auVar62._0_4_;
      auVar187._4_4_ = auVar56._4_4_ + auVar62._4_4_;
      auVar187._8_4_ = auVar56._8_4_ + auVar62._8_4_;
      auVar187._12_4_ = auVar56._12_4_ + auVar62._12_4_;
      auVar55 = vmaxps_avx(auVar64,auVar174);
      auVar56 = vminps_avx(auVar187,auVar65);
      uVar1 = vcmpps_avx512vl(auVar56,auVar55,1);
    } while ((uVar1 & 3) != 0);
    uVar1 = vcmpps_avx512vl(auVar187,auVar65,1);
    uVar14 = vcmpps_avx512vl(auVar43,auVar174,1);
    if (((ushort)uVar14 & (ushort)uVar1 & 1) == 0) {
      bVar27 = 0;
    }
    else {
      auVar55 = vmovshdup_avx(auVar174);
      bVar27 = auVar57._0_4_ < auVar55._0_4_ & (byte)(uVar1 >> 1) & 0x7f;
    }
    if (((3 < (uint)uVar29 || uVar6 != 0 && !bVar37) | bVar27) == 1) {
      lVar31 = 0xc9;
      do {
        lVar31 = lVar31 + -1;
        if (lVar31 == 0) goto LAB_017e034e;
        auVar43 = vsubss_avx512f(auVar54,auVar62);
        fVar204 = auVar43._0_4_;
        fVar206 = fVar204 * fVar204 * fVar204;
        fVar205 = auVar62._0_4_;
        fVar195 = fVar205 * 3.0 * fVar204 * fVar204;
        fVar204 = fVar204 * fVar205 * fVar205 * 3.0;
        auVar135._4_4_ = fVar206;
        auVar135._0_4_ = fVar206;
        auVar135._8_4_ = fVar206;
        auVar135._12_4_ = fVar206;
        auVar130._4_4_ = fVar195;
        auVar130._0_4_ = fVar195;
        auVar130._8_4_ = fVar195;
        auVar130._12_4_ = fVar195;
        auVar105._4_4_ = fVar204;
        auVar105._0_4_ = fVar204;
        auVar105._8_4_ = fVar204;
        auVar105._12_4_ = fVar204;
        fVar205 = fVar205 * fVar205 * fVar205;
        auVar157._0_4_ = (float)local_290._0_4_ * fVar205;
        auVar157._4_4_ = (float)local_290._4_4_ * fVar205;
        auVar157._8_4_ = fStack_288 * fVar205;
        auVar157._12_4_ = fStack_284 * fVar205;
        auVar43 = vfmadd231ps_fma(auVar157,auVar40,auVar105);
        auVar43 = vfmadd231ps_fma(auVar43,auVar44,auVar130);
        auVar43 = vfmadd231ps_fma(auVar43,auVar39,auVar135);
        auVar106._8_8_ = auVar43._0_8_;
        auVar106._0_8_ = auVar43._0_8_;
        auVar43 = vshufpd_avx(auVar43,auVar43,3);
        auVar55 = vshufps_avx(auVar62,auVar62,0x55);
        auVar43 = vsubps_avx(auVar43,auVar106);
        auVar55 = vfmadd213ps_fma(auVar43,auVar55,auVar106);
        fVar206 = auVar55._0_4_;
        auVar43 = vshufps_avx(auVar55,auVar55,0x55);
        auVar107._0_4_ = auVar50._0_4_ * fVar206 + auVar68._0_4_ * auVar43._0_4_;
        auVar107._4_4_ = auVar50._4_4_ * fVar206 + auVar68._4_4_ * auVar43._4_4_;
        auVar107._8_4_ = auVar50._8_4_ * fVar206 + auVar68._8_4_ * auVar43._8_4_;
        auVar107._12_4_ = auVar50._12_4_ * fVar206 + auVar68._12_4_ * auVar43._12_4_;
        auVar62 = vsubps_avx(auVar62,auVar107);
        auVar43 = vandps_avx512vl(auVar55,auVar242._0_16_);
        auVar55 = vprolq_avx512vl(auVar43,0x20);
        auVar43 = vmaxss_avx(auVar55,auVar43);
        bVar37 = auVar43._0_4_ <= (float)local_2a0._0_4_;
      } while ((float)local_2a0._0_4_ <= auVar43._0_4_);
      auVar43 = vucomiss_avx512f(auVar66);
      if (bVar37) {
        auVar50 = vucomiss_avx512f(auVar43);
        auVar245 = ZEXT1664(auVar50);
        if (bVar37) {
          vmovshdup_avx(auVar43);
          auVar50 = vucomiss_avx512f(auVar66);
          if (bVar37) {
            auVar54 = vucomiss_avx512f(auVar50);
            auVar245 = ZEXT1664(auVar54);
            if (bVar37) {
              auVar55 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                      ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
              auVar61 = vinsertps_avx(auVar55,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),
                                      0x28);
              auVar55 = vdpps_avx(auVar61,local_2b0,0x7f);
              auVar56 = vdpps_avx(auVar61,local_2c0,0x7f);
              auVar64 = vdpps_avx(auVar61,local_2d0,0x7f);
              auVar67 = vdpps_avx(auVar61,local_2e0,0x7f);
              auVar59 = vdpps_avx(auVar61,local_2f0,0x7f);
              auVar60 = vdpps_avx(auVar61,local_300,0x7f);
              auVar63 = vdpps_avx(auVar61,local_310,0x7f);
              auVar61 = vdpps_avx(auVar61,local_320,0x7f);
              auVar62 = vsubss_avx512f(auVar54,auVar50);
              fVar205 = auVar50._0_4_;
              auVar50 = vfmadd231ss_fma(ZEXT416((uint)(fVar205 * auVar59._0_4_)),auVar62,auVar55);
              auVar55 = vfmadd231ss_fma(ZEXT416((uint)(auVar60._0_4_ * fVar205)),auVar62,auVar56);
              auVar56 = vfmadd231ss_fma(ZEXT416((uint)(auVar63._0_4_ * fVar205)),auVar62,auVar64);
              auVar64 = vfmadd231ss_fma(ZEXT416((uint)(fVar205 * auVar61._0_4_)),auVar62,auVar67);
              auVar54 = vsubss_avx512f(auVar54,auVar43);
              auVar165._0_4_ = auVar54._0_4_;
              fVar206 = auVar165._0_4_ * auVar165._0_4_ * auVar165._0_4_;
              local_120 = auVar43._0_4_;
              fVar195 = local_120 * 3.0 * auVar165._0_4_ * auVar165._0_4_;
              fVar204 = auVar165._0_4_ * local_120 * local_120 * 3.0;
              fVar218 = local_120 * local_120 * local_120;
              auVar54 = vfmadd231ss_fma(ZEXT416((uint)(fVar218 * auVar64._0_4_)),
                                        ZEXT416((uint)fVar204),auVar56);
              auVar54 = vfmadd231ss_fma(auVar54,ZEXT416((uint)fVar195),auVar55);
              auVar50 = vfmadd231ss_fma(auVar54,ZEXT416((uint)fVar206),auVar50);
              fVar207 = auVar50._0_4_;
              if ((fVar103 <= fVar207) &&
                 (fVar219 = *(float *)(ray + k * 4 + 0x100), fVar207 <= fVar219)) {
                auVar50 = vshufps_avx(auVar43,auVar43,0x55);
                auVar55 = vsubps_avx512vl(auVar45,auVar50);
                fVar220 = auVar50._0_4_;
                auVar193._0_4_ = fVar220 * (float)local_340._0_4_;
                fVar221 = auVar50._4_4_;
                auVar193._4_4_ = fVar221 * (float)local_340._4_4_;
                fVar226 = auVar50._8_4_;
                auVar193._8_4_ = fVar226 * fStack_338;
                fVar227 = auVar50._12_4_;
                auVar193._12_4_ = fVar227 * fStack_334;
                auVar203._0_4_ = fVar220 * (float)local_390._0_4_;
                auVar203._4_4_ = fVar221 * (float)local_390._4_4_;
                auVar203._8_4_ = fVar226 * fStack_388;
                auVar203._12_4_ = fVar227 * fStack_384;
                auVar216._0_4_ = fVar220 * (float)local_3a0._0_4_;
                auVar216._4_4_ = fVar221 * (float)local_3a0._4_4_;
                auVar216._8_4_ = fVar226 * fStack_398;
                auVar216._12_4_ = fVar227 * fStack_394;
                auVar175._0_4_ = fVar220 * (float)local_360._0_4_;
                auVar175._4_4_ = fVar221 * (float)local_360._4_4_;
                auVar175._8_4_ = fVar226 * fStack_358;
                auVar175._12_4_ = fVar227 * fStack_354;
                auVar45 = vfmadd231ps_fma(auVar193,auVar55,local_330);
                auVar50 = vfmadd231ps_fma(auVar203,auVar55,local_370);
                auVar54 = vfmadd231ps_fma(auVar216,auVar55,local_380);
                auVar55 = vfmadd231ps_fma(auVar175,auVar55,local_350);
                auVar45 = vsubps_avx(auVar50,auVar45);
                auVar50 = vsubps_avx(auVar54,auVar50);
                auVar54 = vsubps_avx(auVar55,auVar54);
                auVar217._0_4_ = local_120 * auVar50._0_4_;
                auVar217._4_4_ = local_120 * auVar50._4_4_;
                auVar217._8_4_ = local_120 * auVar50._8_4_;
                auVar217._12_4_ = local_120 * auVar50._12_4_;
                auVar165._4_4_ = auVar165._0_4_;
                auVar165._8_4_ = auVar165._0_4_;
                auVar165._12_4_ = auVar165._0_4_;
                auVar45 = vfmadd231ps_fma(auVar217,auVar165,auVar45);
                auVar176._0_4_ = local_120 * auVar54._0_4_;
                auVar176._4_4_ = local_120 * auVar54._4_4_;
                auVar176._8_4_ = local_120 * auVar54._8_4_;
                auVar176._12_4_ = local_120 * auVar54._12_4_;
                auVar50 = vfmadd231ps_fma(auVar176,auVar165,auVar50);
                auVar177._0_4_ = local_120 * auVar50._0_4_;
                auVar177._4_4_ = local_120 * auVar50._4_4_;
                auVar177._8_4_ = local_120 * auVar50._8_4_;
                auVar177._12_4_ = local_120 * auVar50._12_4_;
                auVar45 = vfmadd231ps_fma(auVar177,auVar165,auVar45);
                auVar41 = vmulps_avx512vl(auVar45,auVar41);
                pGVar7 = (context->scene->geometries).items[uVar4].ptr;
                if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                  auVar158._0_4_ = fVar218 * (float)local_3e0._0_4_;
                  auVar158._4_4_ = fVar218 * (float)local_3e0._4_4_;
                  auVar158._8_4_ = fVar218 * fStack_3d8;
                  auVar158._12_4_ = fVar218 * fStack_3d4;
                  auVar146._4_4_ = fVar204;
                  auVar146._0_4_ = fVar204;
                  auVar146._8_4_ = fVar204;
                  auVar146._12_4_ = fVar204;
                  auVar45 = vfmadd132ps_fma(auVar146,auVar158,local_3d0);
                  auVar136._4_4_ = fVar195;
                  auVar136._0_4_ = fVar195;
                  auVar136._8_4_ = fVar195;
                  auVar136._12_4_ = fVar195;
                  auVar45 = vfmadd132ps_fma(auVar136,auVar45,local_3c0);
                  auVar131._4_4_ = fVar206;
                  auVar131._0_4_ = fVar206;
                  auVar131._8_4_ = fVar206;
                  auVar131._12_4_ = fVar206;
                  auVar54 = vfmadd132ps_fma(auVar131,auVar45,local_3b0);
                  auVar45 = vshufps_avx(auVar54,auVar54,0xc9);
                  auVar50 = vshufps_avx(auVar41,auVar41,0xc9);
                  auVar132._0_4_ = auVar54._0_4_ * auVar50._0_4_;
                  auVar132._4_4_ = auVar54._4_4_ * auVar50._4_4_;
                  auVar132._8_4_ = auVar54._8_4_ * auVar50._8_4_;
                  auVar132._12_4_ = auVar54._12_4_ * auVar50._12_4_;
                  auVar41 = vfmsub231ps_fma(auVar132,auVar41,auVar45);
                  local_140 = auVar41._0_4_;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x100) = fVar207;
                    uVar109 = vextractps_avx(auVar41,1);
                    *(undefined4 *)(ray + k * 4 + 0x180) = uVar109;
                    uVar109 = vextractps_avx(auVar41,2);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar109;
                    *(undefined4 *)(ray + k * 4 + 0x1c0) = local_140;
                    *(float *)(ray + k * 4 + 0x1e0) = local_120;
                    *(float *)(ray + k * 4 + 0x200) = fVar205;
                    *(uint *)(ray + k * 4 + 0x220) = uVar5;
                    *(uint *)(ray + k * 4 + 0x240) = uVar4;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                    goto LAB_017e034e;
                  }
                  auVar137._8_4_ = 1;
                  auVar137._0_8_ = 0x100000001;
                  auVar137._12_4_ = 1;
                  auVar137._16_4_ = 1;
                  auVar137._20_4_ = 1;
                  auVar137._24_4_ = 1;
                  auVar137._28_4_ = 1;
                  local_100 = vpermps_avx2(auVar137,ZEXT1632(auVar43));
                  auVar88 = vpermps_avx2(auVar137,ZEXT1632(auVar41));
                  auVar147._8_4_ = 2;
                  auVar147._0_8_ = 0x200000002;
                  auVar147._12_4_ = 2;
                  auVar147._16_4_ = 2;
                  auVar147._20_4_ = 2;
                  auVar147._24_4_ = 2;
                  auVar147._28_4_ = 2;
                  local_160 = vpermps_avx2(auVar147,ZEXT1632(auVar41));
                  local_180[0] = (RTCHitN)auVar88[0];
                  local_180[1] = (RTCHitN)auVar88[1];
                  local_180[2] = (RTCHitN)auVar88[2];
                  local_180[3] = (RTCHitN)auVar88[3];
                  local_180[4] = (RTCHitN)auVar88[4];
                  local_180[5] = (RTCHitN)auVar88[5];
                  local_180[6] = (RTCHitN)auVar88[6];
                  local_180[7] = (RTCHitN)auVar88[7];
                  local_180[8] = (RTCHitN)auVar88[8];
                  local_180[9] = (RTCHitN)auVar88[9];
                  local_180[10] = (RTCHitN)auVar88[10];
                  local_180[0xb] = (RTCHitN)auVar88[0xb];
                  local_180[0xc] = (RTCHitN)auVar88[0xc];
                  local_180[0xd] = (RTCHitN)auVar88[0xd];
                  local_180[0xe] = (RTCHitN)auVar88[0xe];
                  local_180[0xf] = (RTCHitN)auVar88[0xf];
                  local_180[0x10] = (RTCHitN)auVar88[0x10];
                  local_180[0x11] = (RTCHitN)auVar88[0x11];
                  local_180[0x12] = (RTCHitN)auVar88[0x12];
                  local_180[0x13] = (RTCHitN)auVar88[0x13];
                  local_180[0x14] = (RTCHitN)auVar88[0x14];
                  local_180[0x15] = (RTCHitN)auVar88[0x15];
                  local_180[0x16] = (RTCHitN)auVar88[0x16];
                  local_180[0x17] = (RTCHitN)auVar88[0x17];
                  local_180[0x18] = (RTCHitN)auVar88[0x18];
                  local_180[0x19] = (RTCHitN)auVar88[0x19];
                  local_180[0x1a] = (RTCHitN)auVar88[0x1a];
                  local_180[0x1b] = (RTCHitN)auVar88[0x1b];
                  local_180[0x1c] = (RTCHitN)auVar88[0x1c];
                  local_180[0x1d] = (RTCHitN)auVar88[0x1d];
                  local_180[0x1e] = (RTCHitN)auVar88[0x1e];
                  local_180[0x1f] = (RTCHitN)auVar88[0x1f];
                  uStack_13c = local_140;
                  uStack_138 = local_140;
                  uStack_134 = local_140;
                  uStack_130 = local_140;
                  uStack_12c = local_140;
                  uStack_128 = local_140;
                  uStack_124 = local_140;
                  fStack_11c = local_120;
                  fStack_118 = local_120;
                  fStack_114 = local_120;
                  fStack_110 = local_120;
                  fStack_10c = local_120;
                  fStack_108 = local_120;
                  fStack_104 = local_120;
                  local_e0 = local_200._0_8_;
                  uStack_d8 = local_200._8_8_;
                  uStack_d0 = local_200._16_8_;
                  uStack_c8 = local_200._24_8_;
                  local_c0 = local_1e0;
                  vpcmpeqd_avx2(local_1e0,local_1e0);
                  uStack_9c = context->user->instID[0];
                  local_a0 = uStack_9c;
                  uStack_98 = uStack_9c;
                  uStack_94 = uStack_9c;
                  uStack_90 = uStack_9c;
                  uStack_8c = uStack_9c;
                  uStack_88 = uStack_9c;
                  uStack_84 = uStack_9c;
                  uStack_7c = context->user->instPrimID[0];
                  local_80 = uStack_7c;
                  uStack_78 = uStack_7c;
                  uStack_74 = uStack_7c;
                  uStack_70 = uStack_7c;
                  uStack_6c = uStack_7c;
                  uStack_68 = uStack_7c;
                  uStack_64 = uStack_7c;
                  *(float *)(ray + k * 4 + 0x100) = fVar207;
                  local_420 = local_220;
                  local_460.valid = (int *)local_420;
                  local_460.geometryUserPtr = pGVar7->userPtr;
                  local_460.context = context->user;
                  local_460.hit = local_180;
                  local_460.N = 8;
                  local_460.ray = (RTCRayN *)ray;
                  if (pGVar7->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar7->intersectionFilterN)(&local_460);
                    auVar43 = vxorps_avx512vl(auVar66,auVar66);
                    auVar244 = ZEXT1664(auVar43);
                    auVar245 = ZEXT464(0x3f800000);
                    auVar241 = ZEXT3264(_DAT_01fb9fe0);
                    auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                    auVar240 = ZEXT1664(auVar43);
                    auVar88 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                    auVar239 = ZEXT3264(auVar88);
                    auVar43 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                    auVar238 = ZEXT1664(auVar43);
                    auVar43 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                    auVar237 = ZEXT1664(auVar43);
                    auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar243 = ZEXT1664(auVar43);
                    auVar43 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    auVar242 = ZEXT1664(auVar43);
                  }
                  auVar43 = auVar244._0_16_;
                  if (local_420 != (undefined1  [32])0x0) {
                    p_Var10 = context->args->filter;
                    if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var10)(&local_460);
                      auVar43 = vxorps_avx512vl(auVar43,auVar43);
                      auVar244 = ZEXT1664(auVar43);
                      auVar245 = ZEXT464(0x3f800000);
                      auVar241 = ZEXT3264(_DAT_01fb9fe0);
                      auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                      auVar240 = ZEXT1664(auVar43);
                      auVar88 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                      auVar239 = ZEXT3264(auVar88);
                      auVar43 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                      auVar238 = ZEXT1664(auVar43);
                      auVar43 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                      auVar237 = ZEXT1664(auVar43);
                      auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                      auVar243 = ZEXT1664(auVar43);
                      auVar43 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                      auVar242 = ZEXT1664(auVar43);
                    }
                    if (local_420 != (undefined1  [32])0x0) {
                      uVar1 = vptestmd_avx512vl(local_420,local_420);
                      iVar20 = *(int *)(local_460.hit + 4);
                      iVar21 = *(int *)(local_460.hit + 8);
                      iVar22 = *(int *)(local_460.hit + 0xc);
                      iVar23 = *(int *)(local_460.hit + 0x10);
                      iVar24 = *(int *)(local_460.hit + 0x14);
                      iVar25 = *(int *)(local_460.hit + 0x18);
                      iVar26 = *(int *)(local_460.hit + 0x1c);
                      bVar27 = (byte)uVar1;
                      bVar37 = (bool)((byte)(uVar1 >> 1) & 1);
                      bVar38 = (bool)((byte)(uVar1 >> 2) & 1);
                      bVar35 = (bool)((byte)(uVar1 >> 3) & 1);
                      bVar36 = (bool)((byte)(uVar1 >> 4) & 1);
                      bVar11 = (bool)((byte)(uVar1 >> 5) & 1);
                      bVar12 = (bool)((byte)(uVar1 >> 6) & 1);
                      bVar13 = SUB81(uVar1 >> 7,0);
                      *(uint *)(local_460.ray + 0x180) =
                           (uint)(bVar27 & 1) * *(int *)local_460.hit |
                           (uint)!(bool)(bVar27 & 1) * *(int *)(local_460.ray + 0x180);
                      *(uint *)(local_460.ray + 0x184) =
                           (uint)bVar37 * iVar20 | (uint)!bVar37 * *(int *)(local_460.ray + 0x184);
                      *(uint *)(local_460.ray + 0x188) =
                           (uint)bVar38 * iVar21 | (uint)!bVar38 * *(int *)(local_460.ray + 0x188);
                      *(uint *)(local_460.ray + 0x18c) =
                           (uint)bVar35 * iVar22 | (uint)!bVar35 * *(int *)(local_460.ray + 0x18c);
                      *(uint *)(local_460.ray + 400) =
                           (uint)bVar36 * iVar23 | (uint)!bVar36 * *(int *)(local_460.ray + 400);
                      *(uint *)(local_460.ray + 0x194) =
                           (uint)bVar11 * iVar24 | (uint)!bVar11 * *(int *)(local_460.ray + 0x194);
                      *(uint *)(local_460.ray + 0x198) =
                           (uint)bVar12 * iVar25 | (uint)!bVar12 * *(int *)(local_460.ray + 0x198);
                      *(uint *)(local_460.ray + 0x19c) =
                           (uint)bVar13 * iVar26 | (uint)!bVar13 * *(int *)(local_460.ray + 0x19c);
                      iVar20 = *(int *)(local_460.hit + 0x24);
                      iVar21 = *(int *)(local_460.hit + 0x28);
                      iVar22 = *(int *)(local_460.hit + 0x2c);
                      iVar23 = *(int *)(local_460.hit + 0x30);
                      iVar24 = *(int *)(local_460.hit + 0x34);
                      iVar25 = *(int *)(local_460.hit + 0x38);
                      iVar26 = *(int *)(local_460.hit + 0x3c);
                      bVar37 = (bool)((byte)(uVar1 >> 1) & 1);
                      bVar38 = (bool)((byte)(uVar1 >> 2) & 1);
                      bVar35 = (bool)((byte)(uVar1 >> 3) & 1);
                      bVar36 = (bool)((byte)(uVar1 >> 4) & 1);
                      bVar11 = (bool)((byte)(uVar1 >> 5) & 1);
                      bVar12 = (bool)((byte)(uVar1 >> 6) & 1);
                      bVar13 = SUB81(uVar1 >> 7,0);
                      *(uint *)(local_460.ray + 0x1a0) =
                           (uint)(bVar27 & 1) * *(int *)(local_460.hit + 0x20) |
                           (uint)!(bool)(bVar27 & 1) * *(int *)(local_460.ray + 0x1a0);
                      *(uint *)(local_460.ray + 0x1a4) =
                           (uint)bVar37 * iVar20 | (uint)!bVar37 * *(int *)(local_460.ray + 0x1a4);
                      *(uint *)(local_460.ray + 0x1a8) =
                           (uint)bVar38 * iVar21 | (uint)!bVar38 * *(int *)(local_460.ray + 0x1a8);
                      *(uint *)(local_460.ray + 0x1ac) =
                           (uint)bVar35 * iVar22 | (uint)!bVar35 * *(int *)(local_460.ray + 0x1ac);
                      *(uint *)(local_460.ray + 0x1b0) =
                           (uint)bVar36 * iVar23 | (uint)!bVar36 * *(int *)(local_460.ray + 0x1b0);
                      *(uint *)(local_460.ray + 0x1b4) =
                           (uint)bVar11 * iVar24 | (uint)!bVar11 * *(int *)(local_460.ray + 0x1b4);
                      *(uint *)(local_460.ray + 0x1b8) =
                           (uint)bVar12 * iVar25 | (uint)!bVar12 * *(int *)(local_460.ray + 0x1b8);
                      *(uint *)(local_460.ray + 0x1bc) =
                           (uint)bVar13 * iVar26 | (uint)!bVar13 * *(int *)(local_460.ray + 0x1bc);
                      iVar20 = *(int *)(local_460.hit + 0x44);
                      iVar21 = *(int *)(local_460.hit + 0x48);
                      iVar22 = *(int *)(local_460.hit + 0x4c);
                      iVar23 = *(int *)(local_460.hit + 0x50);
                      iVar24 = *(int *)(local_460.hit + 0x54);
                      iVar25 = *(int *)(local_460.hit + 0x58);
                      iVar26 = *(int *)(local_460.hit + 0x5c);
                      bVar37 = (bool)((byte)(uVar1 >> 1) & 1);
                      bVar38 = (bool)((byte)(uVar1 >> 2) & 1);
                      bVar35 = (bool)((byte)(uVar1 >> 3) & 1);
                      bVar36 = (bool)((byte)(uVar1 >> 4) & 1);
                      bVar11 = (bool)((byte)(uVar1 >> 5) & 1);
                      bVar12 = (bool)((byte)(uVar1 >> 6) & 1);
                      bVar13 = SUB81(uVar1 >> 7,0);
                      *(uint *)(local_460.ray + 0x1c0) =
                           (uint)(bVar27 & 1) * *(int *)(local_460.hit + 0x40) |
                           (uint)!(bool)(bVar27 & 1) * *(int *)(local_460.ray + 0x1c0);
                      *(uint *)(local_460.ray + 0x1c4) =
                           (uint)bVar37 * iVar20 | (uint)!bVar37 * *(int *)(local_460.ray + 0x1c4);
                      *(uint *)(local_460.ray + 0x1c8) =
                           (uint)bVar38 * iVar21 | (uint)!bVar38 * *(int *)(local_460.ray + 0x1c8);
                      *(uint *)(local_460.ray + 0x1cc) =
                           (uint)bVar35 * iVar22 | (uint)!bVar35 * *(int *)(local_460.ray + 0x1cc);
                      *(uint *)(local_460.ray + 0x1d0) =
                           (uint)bVar36 * iVar23 | (uint)!bVar36 * *(int *)(local_460.ray + 0x1d0);
                      *(uint *)(local_460.ray + 0x1d4) =
                           (uint)bVar11 * iVar24 | (uint)!bVar11 * *(int *)(local_460.ray + 0x1d4);
                      *(uint *)(local_460.ray + 0x1d8) =
                           (uint)bVar12 * iVar25 | (uint)!bVar12 * *(int *)(local_460.ray + 0x1d8);
                      *(uint *)(local_460.ray + 0x1dc) =
                           (uint)bVar13 * iVar26 | (uint)!bVar13 * *(int *)(local_460.ray + 0x1dc);
                      iVar20 = *(int *)(local_460.hit + 100);
                      iVar21 = *(int *)(local_460.hit + 0x68);
                      iVar22 = *(int *)(local_460.hit + 0x6c);
                      iVar23 = *(int *)(local_460.hit + 0x70);
                      iVar24 = *(int *)(local_460.hit + 0x74);
                      iVar25 = *(int *)(local_460.hit + 0x78);
                      iVar26 = *(int *)(local_460.hit + 0x7c);
                      bVar37 = (bool)((byte)(uVar1 >> 1) & 1);
                      bVar38 = (bool)((byte)(uVar1 >> 2) & 1);
                      bVar35 = (bool)((byte)(uVar1 >> 3) & 1);
                      bVar36 = (bool)((byte)(uVar1 >> 4) & 1);
                      bVar11 = (bool)((byte)(uVar1 >> 5) & 1);
                      bVar12 = (bool)((byte)(uVar1 >> 6) & 1);
                      bVar13 = SUB81(uVar1 >> 7,0);
                      *(uint *)(local_460.ray + 0x1e0) =
                           (uint)(bVar27 & 1) * *(int *)(local_460.hit + 0x60) |
                           (uint)!(bool)(bVar27 & 1) * *(int *)(local_460.ray + 0x1e0);
                      *(uint *)(local_460.ray + 0x1e4) =
                           (uint)bVar37 * iVar20 | (uint)!bVar37 * *(int *)(local_460.ray + 0x1e4);
                      *(uint *)(local_460.ray + 0x1e8) =
                           (uint)bVar38 * iVar21 | (uint)!bVar38 * *(int *)(local_460.ray + 0x1e8);
                      *(uint *)(local_460.ray + 0x1ec) =
                           (uint)bVar35 * iVar22 | (uint)!bVar35 * *(int *)(local_460.ray + 0x1ec);
                      *(uint *)(local_460.ray + 0x1f0) =
                           (uint)bVar36 * iVar23 | (uint)!bVar36 * *(int *)(local_460.ray + 0x1f0);
                      *(uint *)(local_460.ray + 500) =
                           (uint)bVar11 * iVar24 | (uint)!bVar11 * *(int *)(local_460.ray + 500);
                      *(uint *)(local_460.ray + 0x1f8) =
                           (uint)bVar12 * iVar25 | (uint)!bVar12 * *(int *)(local_460.ray + 0x1f8);
                      *(uint *)(local_460.ray + 0x1fc) =
                           (uint)bVar13 * iVar26 | (uint)!bVar13 * *(int *)(local_460.ray + 0x1fc);
                      iVar20 = *(int *)(local_460.hit + 0x84);
                      iVar21 = *(int *)(local_460.hit + 0x88);
                      iVar22 = *(int *)(local_460.hit + 0x8c);
                      iVar23 = *(int *)(local_460.hit + 0x90);
                      iVar24 = *(int *)(local_460.hit + 0x94);
                      iVar25 = *(int *)(local_460.hit + 0x98);
                      iVar26 = *(int *)(local_460.hit + 0x9c);
                      bVar37 = (bool)((byte)(uVar1 >> 1) & 1);
                      bVar38 = (bool)((byte)(uVar1 >> 2) & 1);
                      bVar35 = (bool)((byte)(uVar1 >> 3) & 1);
                      bVar36 = (bool)((byte)(uVar1 >> 4) & 1);
                      bVar11 = (bool)((byte)(uVar1 >> 5) & 1);
                      bVar12 = (bool)((byte)(uVar1 >> 6) & 1);
                      bVar13 = SUB81(uVar1 >> 7,0);
                      *(uint *)(local_460.ray + 0x200) =
                           (uint)(bVar27 & 1) * *(int *)(local_460.hit + 0x80) |
                           (uint)!(bool)(bVar27 & 1) * *(int *)(local_460.ray + 0x200);
                      *(uint *)(local_460.ray + 0x204) =
                           (uint)bVar37 * iVar20 | (uint)!bVar37 * *(int *)(local_460.ray + 0x204);
                      *(uint *)(local_460.ray + 0x208) =
                           (uint)bVar38 * iVar21 | (uint)!bVar38 * *(int *)(local_460.ray + 0x208);
                      *(uint *)(local_460.ray + 0x20c) =
                           (uint)bVar35 * iVar22 | (uint)!bVar35 * *(int *)(local_460.ray + 0x20c);
                      *(uint *)(local_460.ray + 0x210) =
                           (uint)bVar36 * iVar23 | (uint)!bVar36 * *(int *)(local_460.ray + 0x210);
                      *(uint *)(local_460.ray + 0x214) =
                           (uint)bVar11 * iVar24 | (uint)!bVar11 * *(int *)(local_460.ray + 0x214);
                      *(uint *)(local_460.ray + 0x218) =
                           (uint)bVar12 * iVar25 | (uint)!bVar12 * *(int *)(local_460.ray + 0x218);
                      *(uint *)(local_460.ray + 0x21c) =
                           (uint)bVar13 * iVar26 | (uint)!bVar13 * *(int *)(local_460.ray + 0x21c);
                      auVar88 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_460.hit + 0xa0));
                      *(undefined1 (*) [32])(local_460.ray + 0x220) = auVar88;
                      auVar88 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_460.hit + 0xc0));
                      *(undefined1 (*) [32])(local_460.ray + 0x240) = auVar88;
                      auVar88 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_460.hit + 0xe0));
                      *(undefined1 (*) [32])(local_460.ray + 0x260) = auVar88;
                      auVar88 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_460.hit + 0x100));
                      *(undefined1 (*) [32])(local_460.ray + 0x280) = auVar88;
                      goto LAB_017e034e;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x100) = fVar219;
                }
              }
            }
          }
        }
      }
      goto LAB_017e034e;
    }
    auVar66 = vinsertps_avx(auVar57,auVar58,0x10);
  } while( true );
}

Assistant:

static __forceinline void intersect_hn(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; Vec3fa n0,dn0,n1,dn1; geom->gather_hermite(p0,t0,n0,dn0,p1,t1,n1,dn1,geom->curve(primID));
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,n0,dn0,n1,dn1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }